

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack8to4_int8.h
# Opt level: O0

void ncnn::im2col_sgemm_pack8to4_int8_sse(Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Option *opt)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  short sVar25;
  undefined4 uVar26;
  undefined6 uVar27;
  short sVar28;
  undefined4 uVar29;
  undefined6 uVar30;
  undefined4 uVar31;
  undefined6 uVar32;
  undefined4 uVar33;
  undefined6 uVar34;
  undefined4 uVar35;
  undefined6 uVar36;
  undefined4 uVar37;
  undefined6 uVar38;
  undefined4 uVar39;
  undefined6 uVar40;
  undefined4 uVar41;
  undefined6 uVar42;
  undefined4 uVar43;
  undefined6 uVar44;
  undefined4 uVar45;
  undefined6 uVar46;
  undefined8 uVar47;
  undefined8 uVar48;
  undefined8 uVar49;
  undefined8 uVar50;
  undefined8 uVar51;
  undefined8 uVar52;
  undefined8 uVar53;
  undefined8 uVar54;
  undefined8 uVar55;
  undefined8 uVar56;
  undefined8 uVar57;
  undefined8 uVar58;
  undefined8 uVar59;
  undefined8 uVar60;
  undefined8 uVar61;
  undefined8 uVar62;
  undefined8 uVar63;
  undefined8 uVar64;
  undefined8 uVar65;
  undefined8 uVar66;
  undefined8 uVar67;
  undefined8 uVar68;
  undefined8 uVar69;
  undefined8 uVar70;
  short sVar71;
  undefined4 uVar72;
  undefined6 uVar73;
  short sVar74;
  undefined4 uVar75;
  undefined6 uVar76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  int iVar91;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  short sVar92;
  short sVar106;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  short sVar93;
  short sVar107;
  undefined1 auVar104 [16];
  short sVar94;
  short sVar95;
  short sVar108;
  short sVar109;
  undefined1 auVar105 [16];
  __m128i _tmp3_2;
  __m128i _tmp2_2;
  __m128i _tmp1_2;
  __m128i _tmp0_2;
  __m128i _sh3;
  __m128i _sl3;
  __m128i _sh2;
  __m128i _sl2;
  __m128i _sh1;
  __m128i _sl1;
  __m128i _sh0;
  __m128i _sl0;
  __m128i _w3_1;
  __m128i _w2_1;
  __m128i _w1_1;
  __m128i _w0_1;
  __m128i _extw23_1;
  __m128i _extw01_1;
  __m128i _w23_1;
  __m128i _w01_1;
  __m128i _val;
  int j_1;
  __m128i _sum3;
  __m128i _sum2;
  __m128i _sum1;
  __m128i _sum0;
  int nn_1;
  char *kptr0_1;
  char *tmpptr_3;
  __m128i _tmp3_1;
  __m128i _tmp2_1;
  __m128i _tmp1_1;
  __m128i _tmp0_1;
  __m128i _tmp3;
  __m128i _tmp2;
  __m128i _tmp1;
  __m128i _tmp0;
  __m128i _sh13;
  __m128i _sl13;
  __m128i _sh12;
  __m128i _sl12;
  __m128i _sh11;
  __m128i _sl11;
  __m128i _sh10;
  __m128i _sl10;
  __m128i _sh03;
  __m128i _sl03;
  __m128i _sh02;
  __m128i _sl02;
  __m128i _sh01;
  __m128i _sl01;
  __m128i _sh00;
  __m128i _sl00;
  __m128i _w3;
  __m128i _w2;
  __m128i _w1;
  __m128i _w0;
  __m128i _extw23;
  __m128i _extw01;
  __m128i _w23;
  __m128i _w01;
  __m128i _val1;
  __m128i _val0;
  __m128i _extval01;
  __m128i _val01;
  int j;
  __m128i _sum13;
  __m128i _sum12;
  __m128i _sum11;
  __m128i _sum10;
  __m128i _sum03;
  __m128i _sum02;
  __m128i _sum01;
  __m128i _sum00;
  int nn;
  char *kptr0;
  char *tmpptr_2;
  int i_2;
  int *outptr0;
  int p;
  int k_1;
  int64_t *img0_1;
  int q_1;
  int64_t *tmpptr_1;
  int i_1;
  __m128i _v;
  int k;
  int64_t *img0;
  int q;
  int64_t *tmpptr;
  int i;
  int ii;
  int nn_size;
  int remain_size_start;
  Mat tmp;
  int outch;
  int inch;
  int maxk;
  int size;
  Mat *m_7;
  Mat *m_5;
  Mat *m_4;
  Mat *m_2;
  Mat *m;
  Mat *m_8;
  Mat *m_6;
  Mat *m_3;
  Mat *m_1;
  Option *in_stack_ffffffffffffd518;
  Mat *in_stack_ffffffffffffd520;
  Mat *in_stack_ffffffffffffd528;
  Mat *in_stack_ffffffffffffd530;
  void **ppvVar110;
  size_t in_stack_ffffffffffffd538;
  int in_stack_ffffffffffffd544;
  undefined8 in_stack_ffffffffffffd548;
  int iVar111;
  Mat *in_stack_ffffffffffffd550;
  undefined8 local_2aa8;
  undefined4 in_stack_ffffffffffffd5b0;
  undefined4 in_stack_ffffffffffffd5b4;
  undefined8 local_2948;
  undefined8 uStack_2940;
  undefined8 local_2928;
  undefined8 uStack_2920;
  undefined8 local_2908;
  undefined8 uStack_2900;
  undefined8 local_28e8;
  undefined8 uStack_28e0;
  undefined8 local_2738;
  undefined8 local_2718;
  undefined8 local_26b8;
  undefined8 local_2698;
  undefined8 local_2438;
  undefined8 uStack_2430;
  undefined8 local_2418;
  undefined8 uStack_2410;
  undefined8 local_23f8;
  undefined8 uStack_23f0;
  undefined8 local_23d8;
  undefined8 uStack_23d0;
  undefined8 local_23b8;
  undefined8 uStack_23b0;
  undefined8 local_2398;
  undefined8 uStack_2390;
  undefined8 local_2378;
  undefined8 uStack_2370;
  undefined8 local_2358;
  undefined8 uStack_2350;
  undefined8 local_2038;
  int local_1f1c;
  undefined8 local_1f18;
  undefined8 uStack_1f10;
  undefined8 local_1f08;
  undefined8 uStack_1f00;
  undefined8 local_1ef8;
  undefined8 uStack_1ef0;
  undefined8 local_1ee8;
  undefined8 uStack_1ee0;
  undefined8 local_1ec8;
  undefined8 local_1ec0;
  undefined8 local_1eb8;
  undefined4 local_1eb0;
  long local_1ea8;
  undefined4 local_1ea0;
  undefined4 local_1e9c;
  undefined4 local_1e98;
  undefined4 local_1e94;
  undefined4 local_1e90;
  undefined8 local_1e88;
  long *local_1e80;
  undefined8 local_1e78;
  undefined8 local_1e70;
  undefined8 local_1e68;
  undefined4 local_1e60;
  long *local_1e58;
  undefined4 local_1e50;
  undefined4 local_1e4c;
  undefined4 local_1e48;
  undefined4 local_1e44;
  undefined4 local_1e40;
  undefined8 local_1e38;
  long *local_1e30;
  undefined8 local_1e28;
  undefined8 uStack_1e20;
  undefined8 local_1e18;
  undefined8 uStack_1e10;
  undefined8 local_1e08;
  undefined8 uStack_1e00;
  undefined8 local_1df8;
  undefined8 uStack_1df0;
  undefined8 local_1de8;
  undefined8 uStack_1de0;
  undefined8 local_1dd8;
  undefined8 uStack_1dd0;
  undefined8 local_1dc8;
  undefined8 uStack_1dc0;
  undefined8 local_1db8;
  undefined8 uStack_1db0;
  undefined8 local_1da8;
  undefined8 uStack_1da0;
  undefined8 local_1d98;
  undefined8 uStack_1d90;
  undefined8 local_1d88;
  undefined8 uStack_1d80;
  undefined8 local_1d78;
  undefined8 uStack_1d70;
  undefined8 local_1d68;
  undefined8 uStack_1d60;
  undefined8 local_1d58;
  undefined8 uStack_1d50;
  undefined8 local_1d48;
  undefined8 uStack_1d40;
  undefined8 local_1d38;
  undefined8 uStack_1d30;
  undefined8 local_1d28;
  undefined8 uStack_1d20;
  undefined8 local_1d18;
  undefined8 uStack_1d10;
  undefined8 local_1d08;
  undefined8 uStack_1d00;
  undefined8 local_1cf8;
  undefined8 uStack_1cf0;
  undefined8 local_1ce8;
  undefined8 uStack_1ce0;
  undefined8 local_1cd8;
  undefined8 uStack_1cd0;
  undefined8 local_1cc8;
  undefined8 uStack_1cc0;
  undefined8 local_1cb8;
  undefined8 uStack_1cb0;
  undefined8 local_1ca8;
  undefined8 uStack_1ca0;
  undefined8 local_1c98;
  undefined8 uStack_1c90;
  undefined8 local_1c88;
  undefined8 uStack_1c80;
  undefined8 local_1c78;
  undefined8 uStack_1c70;
  undefined8 local_1c68;
  undefined8 uStack_1c60;
  undefined8 local_1c58;
  undefined8 uStack_1c50;
  long local_1c48;
  long lStack_1c40;
  long local_1c38;
  long lStack_1c30;
  undefined8 local_1c28;
  undefined8 uStack_1c20;
  undefined8 local_1c18;
  undefined8 uStack_1c10;
  undefined8 local_1c08;
  undefined8 uStack_1c00;
  long local_1bf8;
  long lStack_1bf0;
  int local_1bdc;
  undefined8 local_1bd8;
  undefined8 uStack_1bd0;
  undefined8 local_1bc8;
  undefined8 uStack_1bc0;
  undefined8 local_1bb8;
  undefined8 uStack_1bb0;
  undefined8 local_1ba8;
  undefined8 uStack_1ba0;
  undefined8 local_1b98;
  undefined8 uStack_1b90;
  undefined8 local_1b88;
  undefined8 uStack_1b80;
  undefined8 local_1b78;
  undefined8 uStack_1b70;
  undefined8 local_1b68;
  undefined8 uStack_1b60;
  int local_1b4c;
  undefined8 local_1b48;
  undefined8 local_1b40;
  undefined8 local_1b38;
  undefined4 local_1b30;
  long local_1b28;
  undefined4 local_1b20;
  undefined4 local_1b1c;
  undefined4 local_1b18;
  undefined4 local_1b14;
  undefined4 local_1b10;
  undefined8 local_1b08;
  long *local_1b00;
  undefined8 local_1af8;
  undefined8 local_1af0;
  undefined8 local_1ae8;
  undefined4 local_1ae0;
  long *local_1ad8;
  undefined4 local_1ad0;
  undefined4 local_1acc;
  undefined4 local_1ac8;
  undefined4 local_1ac4;
  undefined4 local_1ac0;
  undefined8 local_1ab8;
  long *local_1ab0;
  int local_1aa4;
  undefined8 local_1aa0;
  undefined8 local_1a98;
  undefined8 local_1a90;
  undefined4 local_1a88;
  long local_1a80;
  undefined4 local_1a78;
  undefined4 local_1a74;
  undefined4 local_1a70;
  undefined4 local_1a6c;
  undefined4 local_1a68;
  undefined8 local_1a60;
  undefined8 *local_1a58;
  int local_1a50;
  int local_1a4c;
  undefined8 local_1a48;
  undefined8 local_1a40;
  undefined8 local_1a38;
  undefined4 local_1a30;
  long local_1a28;
  undefined4 local_1a20;
  undefined4 local_1a1c;
  undefined4 local_1a18;
  undefined4 local_1a14;
  undefined4 local_1a10;
  undefined8 local_1a08;
  undefined8 *local_1a00;
  int local_19f4;
  undefined8 local_19f0;
  undefined8 local_19e8;
  undefined8 local_19e0;
  undefined4 local_19d8;
  long *local_19d0;
  undefined4 local_19c8;
  undefined4 local_19c4;
  undefined4 local_19c0;
  undefined4 local_19bc;
  undefined4 local_19b8;
  undefined8 local_19b0;
  undefined8 *local_19a8;
  int local_199c;
  undefined8 local_1998;
  undefined8 uStack_1990;
  int local_197c;
  undefined8 local_1978;
  undefined8 local_1970;
  undefined8 local_1968;
  undefined4 local_1960;
  long local_1958;
  undefined4 local_1950;
  undefined4 local_194c;
  undefined4 local_1948;
  undefined4 local_1944;
  undefined4 local_1940;
  undefined8 local_1938;
  undefined8 *local_1930;
  int local_1924;
  undefined8 local_1920;
  undefined8 local_1918;
  undefined8 local_1910;
  undefined4 local_1908;
  long *local_1900;
  undefined4 local_18f8;
  undefined4 local_18f4;
  undefined4 local_18f0;
  undefined4 local_18ec;
  undefined4 local_18e8;
  undefined8 local_18e0;
  undefined8 *local_18d8;
  int local_18cc;
  int local_18c8;
  int local_18c4;
  int local_18c0;
  void *local_18b0;
  int *local_18a8;
  long local_18a0;
  undefined4 local_1898;
  long *local_1890;
  undefined4 local_1888;
  int local_1884;
  int local_1880;
  undefined4 local_187c;
  undefined4 local_1878;
  long local_1870;
  int local_1868;
  int local_1864;
  int local_1860;
  int local_185c;
  long *local_1850;
  long *local_1848;
  long *local_1840;
  void **local_1838;
  undefined8 *local_1830;
  undefined8 *local_1820;
  undefined8 *local_1810;
  undefined8 *local_1800;
  undefined8 *local_17f0;
  undefined8 *local_17e0;
  undefined8 *local_17d0;
  undefined8 *local_17c8;
  undefined8 *local_17b8;
  void **local_17b0;
  int local_1790;
  undefined4 local_178c;
  void **local_1788;
  undefined8 *local_1778;
  undefined8 *local_1758;
  undefined8 *local_1748;
  undefined8 *local_1728;
  undefined8 *local_1708;
  undefined8 *local_16e8;
  undefined8 *local_16c8;
  undefined8 *local_16a8;
  undefined8 *local_1688;
  undefined1 local_167d;
  int local_167c;
  void **local_1678;
  undefined8 *local_1670;
  undefined1 local_164d;
  int local_164c;
  void **local_1648;
  undefined8 *local_1640;
  undefined1 local_161d;
  int local_161c;
  undefined8 *local_1610;
  undefined1 local_15ed;
  int local_15ec;
  void **local_15e8;
  undefined8 *local_15e0;
  undefined1 local_15bd;
  int local_15bc;
  void **local_15b8;
  undefined8 *local_15b0;
  undefined1 local_158d;
  int local_158c;
  undefined8 *local_1580;
  undefined1 local_155d;
  int local_155c;
  undefined8 *local_1550;
  undefined1 local_152d;
  int local_152c;
  undefined8 *local_1520;
  undefined1 local_14fd;
  int local_14fc;
  undefined8 *local_14f0;
  void *local_1408;
  undefined8 local_13f8;
  undefined8 uStack_13f0;
  undefined8 local_13e8;
  undefined8 uStack_13e0;
  int local_13d8;
  int iStack_13d4;
  undefined8 uStack_13d0;
  undefined8 local_13c8;
  undefined8 uStack_13c0;
  int local_13b8;
  int iStack_13b4;
  undefined8 uStack_13b0;
  undefined8 local_13a8;
  undefined8 uStack_13a0;
  undefined8 local_1398;
  undefined8 uStack_1390;
  undefined8 local_1388;
  undefined8 uStack_1380;
  undefined8 local_1378;
  undefined8 uStack_1370;
  undefined8 local_1368;
  undefined8 uStack_1360;
  undefined8 local_1358;
  undefined8 uStack_1350;
  undefined8 local_1348;
  undefined8 uStack_1340;
  undefined8 local_1338;
  undefined8 uStack_1330;
  undefined8 local_1328;
  undefined8 uStack_1320;
  undefined8 local_1318;
  undefined8 uStack_1310;
  undefined8 local_1308;
  undefined8 uStack_1300;
  undefined8 local_12f8;
  undefined8 uStack_12f0;
  undefined8 local_12e8;
  undefined8 uStack_12e0;
  undefined8 local_12d8;
  undefined8 uStack_12d0;
  undefined8 local_12c8;
  undefined8 uStack_12c0;
  undefined8 local_12b8;
  undefined8 uStack_12b0;
  undefined8 local_12a8;
  undefined8 uStack_12a0;
  undefined8 local_1298;
  undefined8 uStack_1290;
  undefined8 local_1288;
  undefined8 uStack_1280;
  undefined8 local_1278;
  undefined8 uStack_1270;
  undefined8 local_1268;
  undefined8 uStack_1260;
  int local_1258;
  int iStack_1254;
  undefined8 uStack_1250;
  undefined8 local_1248;
  undefined8 uStack_1240;
  int local_1238;
  int iStack_1234;
  undefined8 uStack_1230;
  undefined8 local_1228;
  undefined8 uStack_1220;
  int local_1218;
  int iStack_1214;
  undefined8 uStack_1210;
  undefined8 local_1208;
  undefined8 uStack_1200;
  int local_11f8;
  int iStack_11f4;
  undefined8 uStack_11f0;
  undefined8 local_11e8;
  undefined8 uStack_11e0;
  undefined8 local_11d8;
  undefined8 uStack_11d0;
  undefined8 local_11c8;
  undefined8 uStack_11c0;
  undefined8 local_11b8;
  undefined8 uStack_11b0;
  undefined8 local_11a8;
  undefined8 uStack_11a0;
  undefined8 local_1198;
  undefined8 uStack_1190;
  undefined8 local_1188;
  undefined8 uStack_1180;
  undefined8 local_1178;
  undefined8 uStack_1170;
  undefined8 local_1168;
  undefined8 uStack_1160;
  undefined8 local_1158;
  undefined8 uStack_1150;
  undefined8 local_1148;
  undefined8 uStack_1140;
  undefined8 local_1138;
  undefined8 uStack_1130;
  undefined8 local_1128;
  undefined8 uStack_1120;
  undefined8 local_1118;
  undefined8 uStack_1110;
  undefined8 local_1108;
  undefined8 uStack_1100;
  undefined8 local_10f8;
  undefined8 uStack_10f0;
  undefined8 local_10e8;
  undefined8 uStack_10e0;
  undefined8 local_10d8;
  undefined8 uStack_10d0;
  undefined8 local_10c8;
  undefined8 uStack_10c0;
  undefined8 local_10b8;
  undefined8 uStack_10b0;
  undefined8 local_10a8;
  undefined8 uStack_10a0;
  undefined8 local_1098;
  undefined8 uStack_1090;
  undefined8 local_1088;
  undefined8 uStack_1080;
  undefined8 local_1078;
  undefined8 uStack_1070;
  undefined8 local_1068;
  undefined8 uStack_1060;
  undefined8 local_1058;
  undefined8 uStack_1050;
  undefined8 local_1048;
  undefined8 uStack_1040;
  undefined8 local_1038;
  undefined8 uStack_1030;
  undefined8 local_1028;
  undefined8 uStack_1020;
  undefined8 local_1018;
  undefined8 uStack_1010;
  undefined8 local_1008;
  undefined8 uStack_1000;
  undefined8 local_ff8;
  undefined8 uStack_ff0;
  undefined8 local_fe8;
  undefined8 uStack_fe0;
  long local_fd0;
  undefined4 local_fc4;
  long local_fc0;
  long local_fb8;
  undefined4 local_fac;
  int local_fa8;
  int local_fa4;
  undefined8 *local_fa0;
  long local_f98;
  undefined4 local_f8c;
  long local_f88;
  long local_f80;
  undefined4 local_f74;
  int local_f70;
  int local_f6c;
  undefined8 *local_f68;
  long local_f60;
  undefined4 local_f54;
  long local_f50;
  long *local_f48;
  undefined4 local_f3c;
  int local_f38;
  int local_f34;
  undefined8 *local_f30;
  long local_f28;
  undefined4 local_f1c;
  long local_f18;
  long *local_f10;
  undefined4 local_f04;
  int local_f00;
  int local_efc;
  undefined8 *local_ef8;
  long *local_ef0;
  undefined4 local_ee4;
  long local_ee0;
  undefined8 *local_ed8;
  undefined4 local_ecc;
  int local_ec8;
  int local_ec4;
  undefined8 *local_ec0;
  long *local_eb8;
  undefined4 local_eac;
  long local_ea8;
  undefined8 *local_ea0;
  undefined4 local_e94;
  int local_e90;
  int local_e8c;
  undefined8 *local_e88;
  long local_e80;
  undefined4 local_e74;
  long local_e70;
  undefined8 *local_e68;
  undefined4 local_e5c;
  int local_e58;
  int local_e54;
  undefined8 *local_e50;
  long *local_e48;
  undefined4 local_e3c;
  long local_e38;
  long *local_e30;
  undefined4 local_e24;
  int local_e20;
  int local_e1c;
  undefined8 *local_e18;
  long *local_e10;
  undefined4 local_e04;
  long local_e00;
  long *local_df8;
  undefined4 local_dec;
  int local_de8;
  int local_de4;
  undefined8 *local_de0;
  undefined4 local_dd4;
  long local_dd0;
  undefined4 local_dc4;
  long local_dc0;
  undefined4 local_db4;
  long local_db0;
  undefined4 local_da4;
  long local_da0;
  undefined4 local_d94;
  long local_d90;
  undefined4 local_d84;
  long local_d80;
  undefined4 local_d74;
  long local_d70;
  undefined4 local_d64;
  long local_d60;
  undefined4 local_d54;
  long local_d50;
  undefined8 *local_d48;
  undefined8 *local_d40;
  undefined8 *local_d38;
  undefined8 *local_d30;
  undefined8 *local_d28;
  undefined8 *local_d20;
  long *local_d18;
  long *local_d10;
  long *local_d08;
  long *local_d00;
  long *local_cf8;
  undefined8 *local_cf0;
  undefined8 local_ce8;
  undefined8 uStack_ce0;
  undefined8 *local_cd0;
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  undefined8 *local_cb0;
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  undefined8 *local_c90;
  undefined8 local_c88;
  undefined8 uStack_c80;
  undefined8 *local_c78;
  undefined8 *local_c70;
  undefined8 *local_c68;
  undefined8 *local_c60;
  undefined8 local_c58;
  undefined8 uStack_c50;
  undefined8 local_c48;
  undefined8 uStack_c40;
  undefined8 local_c38;
  undefined8 uStack_c30;
  undefined8 local_c28;
  undefined8 uStack_c20;
  undefined8 local_c18;
  undefined8 uStack_c10;
  undefined8 local_c08;
  undefined8 uStack_c00;
  undefined8 local_bf8;
  undefined8 uStack_bf0;
  undefined8 local_be8;
  undefined8 uStack_be0;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  undefined8 local_b98;
  undefined8 uStack_b90;
  undefined8 local_b88;
  undefined8 uStack_b80;
  undefined8 local_b78;
  undefined8 uStack_b70;
  undefined8 local_b68;
  undefined8 uStack_b60;
  undefined8 local_b58;
  undefined8 uStack_b50;
  undefined8 local_b48;
  undefined8 uStack_b40;
  undefined8 local_b38;
  undefined8 uStack_b30;
  undefined8 local_b28;
  undefined8 uStack_b20;
  undefined8 local_b18;
  undefined8 uStack_b10;
  undefined8 local_b08;
  undefined8 uStack_b00;
  undefined8 local_af8;
  undefined8 uStack_af0;
  undefined8 local_ae8;
  undefined8 uStack_ae0;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  undefined8 local_aa8;
  undefined8 uStack_aa0;
  undefined8 local_a98;
  undefined8 uStack_a90;
  undefined8 local_a88;
  undefined8 uStack_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  long local_a68;
  long lStack_a60;
  undefined8 local_a58;
  undefined8 uStack_a50;
  long local_a48;
  long lStack_a40;
  undefined8 local_a38;
  undefined8 uStack_a30;
  long local_a28;
  undefined8 uStack_a20;
  undefined8 local_a18;
  undefined8 uStack_a10;
  long local_a08;
  long lStack_a00;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  long local_9e8;
  long lStack_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  long local_9c8;
  long lStack_9c0;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  long local_9a8;
  long lStack_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  long local_988;
  long lStack_980;
  undefined8 local_978;
  undefined8 uStack_970;
  long local_968;
  long lStack_960;
  undefined8 local_958;
  undefined8 uStack_950;
  long local_948;
  long lStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  long local_928;
  long lStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  undefined8 uStack_820;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  int iStack_cc;
  int local_c8;
  int iStack_c4;
  int iStack_c0;
  int iStack_bc;
  int local_b8;
  int iStack_b4;
  int iStack_ac;
  int local_a8;
  int iStack_a4;
  int iStack_a0;
  int iStack_9c;
  undefined8 local_98;
  int iStack_8c;
  int local_88;
  int iStack_84;
  int iStack_80;
  int iStack_7c;
  int local_78;
  int iStack_74;
  int iStack_6c;
  int local_68;
  int iStack_64;
  int iStack_60;
  int iStack_5c;
  int local_58;
  int iStack_54;
  int iStack_4c;
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  int local_38;
  int iStack_34;
  int iStack_2c;
  int local_28;
  int iStack_24;
  int iStack_20;
  int iStack_1c;
  long local_18;
  undefined8 uStack_10;
  long *local_8;
  
  local_1850 = in_RDX;
  local_1848 = in_RSI;
  local_1840 = in_RDI;
  iVar91 = cpu_support_x86_xop();
  if (iVar91 == 0) {
    local_185c = *(int *)((long)local_1840 + 0x2c);
    local_1860 = (int)local_1840[6];
    local_1864 = (int)local_1840[7];
    local_1868 = (int)local_1848[7];
    local_1838 = &local_18b0;
    local_18b0 = (void *)0x0;
    iVar91 = (int)((ulong)in_stack_ffffffffffffd530 >> 0x20);
    local_18a8 = (int *)0x0;
    local_18a0 = 0;
    local_1898 = 0;
    local_1890 = (long *)0x0;
    local_1888 = 0;
    local_1884 = 0;
    local_1880 = 0;
    local_187c = 0;
    local_1878 = 0;
    local_1870 = 0;
    iVar111 = (int)((ulong)in_stack_ffffffffffffd548 >> 0x20);
    if (local_185c < 2) {
      Mat::create(in_stack_ffffffffffffd550,iVar111,(int)in_stack_ffffffffffffd548,
                  in_stack_ffffffffffffd544,in_stack_ffffffffffffd538,iVar91,
                  (Allocator *)CONCAT44(in_stack_ffffffffffffd5b4,in_stack_ffffffffffffd5b0));
    }
    else {
      Mat::create(in_stack_ffffffffffffd550,iVar111,(int)in_stack_ffffffffffffd548,
                  in_stack_ffffffffffffd544,in_stack_ffffffffffffd538,iVar91,
                  (Allocator *)CONCAT44(in_stack_ffffffffffffd5b4,in_stack_ffffffffffffd5b0));
    }
    local_18c4 = local_185c >> 1;
    for (local_18c8 = 0; local_18c8 < local_18c4; local_18c8 = local_18c8 + 1) {
      local_18cc = local_18c8 * 2;
      local_15bc = local_18cc / 2;
      local_15b0 = &local_1920;
      local_15b8 = &local_18b0;
      local_ed8 = (undefined8 *)((long)local_18b0 + local_1870 * local_15bc * local_18a0);
      local_ec0 = &local_1920;
      local_d90 = (long)local_1884 * (long)local_1880 * local_18a0;
      local_d30 = &local_1920;
      local_1830 = &local_1920;
      local_1900 = local_1890;
      local_d94 = 0x10;
      local_ec4 = local_1884;
      local_ec8 = local_1880;
      local_ecc = local_187c;
      local_ee0 = local_18a0;
      local_ee4 = local_1898;
      local_ef0 = local_1890;
      local_15bd = 1;
      local_1920 = 0;
      local_1910 = 0;
      local_1908 = 0;
      local_18f8 = 0;
      local_18f4 = 0;
      local_18f0 = 0;
      local_18ec = 0;
      local_18e8 = 0;
      local_18e0 = 0;
      local_1918 = 0;
      local_18d8 = local_ed8;
      for (local_1924 = 0; local_1924 < local_1864; local_1924 = local_1924 + 1) {
        local_14f0 = &local_1978;
        local_fa4 = *(int *)((long)local_1840 + 0x2c);
        local_fa8 = (int)local_1840[6];
        local_fac = *(undefined4 *)((long)local_1840 + 0x34);
        local_fb8 = *local_1840 + local_1840[8] * (long)local_1924 * local_1840[2];
        local_fc0 = local_1840[2];
        local_fc4 = (undefined4)local_1840[3];
        local_fd0 = local_1840[4];
        local_fa0 = &local_1978;
        local_d50 = (long)local_fa4 * (long)local_fa8 * local_fc0;
        local_d20 = &local_1978;
        local_1930 = (undefined8 *)(local_fb8 + (long)local_18cc * 8);
        local_1820 = &local_1978;
        local_d54 = 0x10;
        local_14fc = local_1924;
        local_14fd = 1;
        local_1978 = 0;
        local_1968 = 0;
        local_1960 = 0;
        local_1950 = 0;
        local_194c = 0;
        local_1948 = 0;
        local_1944 = 0;
        local_1940 = 0;
        local_1938 = 0;
        local_1970 = 0;
        for (local_197c = 0; local_197c < local_1860; local_197c = local_197c + 1) {
          local_cf0 = local_1930;
          local_1998 = *local_1930;
          uStack_1990 = local_1930[1];
          local_c78 = local_18d8;
          *local_18d8 = local_1998;
          local_18d8[1] = uStack_1990;
          local_18d8 = local_18d8 + 2;
          local_1930 = local_1930 + local_185c;
          local_c88 = local_1998;
          uStack_c80 = uStack_1990;
        }
        local_16a8 = local_1820;
        local_1958 = local_fd0;
      }
      local_1688 = local_1830;
    }
    local_18c0 = local_18c4 * 2;
    for (local_199c = local_18c0; local_199c < local_185c; local_199c = local_199c + 1) {
      local_15ec = local_199c / 2 + local_199c % 2;
      local_15e0 = &local_19f0;
      local_15e8 = &local_18b0;
      local_ea0 = (undefined8 *)((long)local_18b0 + local_1870 * local_15ec * local_18a0);
      local_e88 = &local_19f0;
      local_da0 = (long)local_1884 * (long)local_1880 * local_18a0;
      local_d38 = &local_19f0;
      local_1810 = &local_19f0;
      local_19d0 = local_1890;
      local_da4 = 0x10;
      local_e8c = local_1884;
      local_e90 = local_1880;
      local_e94 = local_187c;
      local_ea8 = local_18a0;
      local_eac = local_1898;
      local_eb8 = local_1890;
      local_15ed = 1;
      local_19f0 = 0;
      local_19e0 = 0;
      local_19d8 = 0;
      local_19c8 = 0;
      local_19c4 = 0;
      local_19c0 = 0;
      local_19bc = 0;
      local_19b8 = 0;
      local_19b0 = 0;
      local_19e8 = 0;
      local_19a8 = local_ea0;
      for (local_19f4 = 0; local_19f4 < local_1864; local_19f4 = local_19f4 + 1) {
        local_1520 = &local_1a48;
        local_f6c = *(int *)((long)local_1840 + 0x2c);
        local_f70 = (int)local_1840[6];
        local_f74 = *(undefined4 *)((long)local_1840 + 0x34);
        local_f80 = *local_1840 + local_1840[8] * (long)local_19f4 * local_1840[2];
        local_f88 = local_1840[2];
        local_f8c = (undefined4)local_1840[3];
        local_f98 = local_1840[4];
        local_f68 = &local_1a48;
        local_d60 = (long)local_f6c * (long)local_f70 * local_f88;
        local_d28 = &local_1a48;
        local_1a00 = (undefined8 *)(local_f80 + (long)local_199c * 8);
        local_1800 = &local_1a48;
        local_d64 = 0x10;
        local_152c = local_19f4;
        local_152d = 1;
        local_1a48 = 0;
        local_1a38 = 0;
        local_1a30 = 0;
        local_1a20 = 0;
        local_1a1c = 0;
        local_1a18 = 0;
        local_1a14 = 0;
        local_1a10 = 0;
        local_1a08 = 0;
        local_1a40 = 0;
        for (local_1a4c = 0; local_1a4c < local_1860; local_1a4c = local_1a4c + 1) {
          *local_19a8 = *local_1a00;
          local_19a8 = local_19a8 + 1;
          local_1a00 = local_1a00 + local_185c;
        }
        local_16e8 = local_1800;
        local_1a28 = local_f98;
      }
      local_16c8 = local_1810;
    }
    for (local_1a50 = 0; local_1a50 < local_1868; local_1a50 = local_1a50 + 1) {
      local_1610 = &local_1aa0;
      local_e54 = *(int *)((long)local_1848 + 0x2c);
      local_e58 = (int)local_1848[6];
      local_e5c = *(undefined4 *)((long)local_1848 + 0x34);
      local_e68 = (undefined8 *)(*local_1848 + local_1848[8] * (long)local_1a50 * local_1848[2]);
      local_e70 = local_1848[2];
      local_e74 = (undefined4)local_1848[3];
      local_e80 = local_1848[4];
      local_e50 = &local_1aa0;
      local_db0 = (long)local_e54 * (long)local_e58 * local_e70;
      local_c70 = &local_1aa0;
      local_17f0 = &local_1aa0;
      local_db4 = 0x10;
      local_161c = local_1a50;
      local_161d = 1;
      local_1aa0 = 0;
      local_1a90 = 0;
      local_1a88 = 0;
      local_1a78 = 0;
      local_1a74 = 0;
      local_1a70 = 0;
      local_1a6c = 0;
      local_1a68 = 0;
      local_1a60 = 0;
      local_1a98 = 0;
      local_1a58 = local_e68;
      for (local_1aa4 = 0; local_1aa4 + 1 < local_185c; local_1aa4 = local_1aa4 + 2) {
        local_164c = local_1aa4 / 2;
        local_1640 = &local_1af8;
        local_1648 = &local_18b0;
        local_e30 = (long *)((long)local_18b0 + local_1870 * local_164c * local_18a0);
        local_e18 = &local_1af8;
        local_dc0 = (long)local_1884 * (long)local_1880 * local_18a0;
        local_c60 = &local_1af8;
        local_17e0 = &local_1af8;
        local_1550 = &local_1b48;
        local_f34 = *(int *)((long)local_1850 + 0x2c);
        local_f38 = (int)local_1850[6];
        local_f3c = *(undefined4 *)((long)local_1850 + 0x34);
        local_f48 = (long *)(*local_1850 + local_1850[8] * (long)local_1a50 * local_1850[2]);
        local_f50 = local_1850[2];
        local_f54 = (undefined4)local_1850[3];
        local_f60 = local_1850[4];
        local_f30 = &local_1b48;
        local_d70 = (long)local_f34 * (long)local_f38 * local_f50;
        local_d40 = &local_1b48;
        local_17d0 = &local_1b48;
        local_1ac0 = 0;
        local_1ac4 = 0;
        local_1ac8 = 0;
        local_1acc = 0;
        local_1ad8 = local_1890;
        local_1ae0 = 0;
        local_1ae8 = 0;
        local_1af0 = 0;
        local_1af8 = 0;
        local_d74 = 0x10;
        local_dc4 = 0x10;
        local_e1c = local_1884;
        local_e20 = local_1880;
        local_e24 = local_187c;
        local_e38 = local_18a0;
        local_e3c = local_1898;
        local_e48 = local_1890;
        local_155c = local_1a50;
        local_155d = 1;
        local_164d = 1;
        local_1ab8 = 0;
        local_1ad0 = 0;
        local_1b48 = 0;
        local_1b38 = 0;
        local_1b30 = 0;
        local_1b20 = 0;
        local_1b1c = 0;
        local_1b18 = 0;
        local_1b14 = 0;
        local_1b10 = 0;
        local_1b08 = 0;
        local_1b40 = 0;
        local_1b4c = local_1864 * local_1860;
        local_b48 = 0;
        uStack_b40 = 0;
        local_1b68 = 0;
        uStack_1b60 = 0;
        local_b58 = 0;
        uStack_b50 = 0;
        local_1b78 = 0;
        uStack_1b70 = 0;
        local_b68 = 0;
        uStack_b60 = 0;
        local_1b88 = 0;
        uStack_1b80 = 0;
        local_b78 = 0;
        uStack_b70 = 0;
        local_1b98 = 0;
        uStack_1b90 = 0;
        local_b88 = 0;
        uStack_b80 = 0;
        local_1ba8 = 0;
        uStack_1ba0 = 0;
        local_b98 = 0;
        uStack_b90 = 0;
        local_1bb8 = 0;
        uStack_1bb0 = 0;
        local_ba8 = 0;
        uStack_ba0 = 0;
        local_1bc8 = 0;
        uStack_1bc0 = 0;
        local_bb8 = 0;
        uStack_bb0 = 0;
        local_1bd8 = 0;
        uStack_1bd0 = 0;
        local_1bdc = 0;
        local_1b00 = local_f48;
        local_1ab0 = local_e30;
        while( true ) {
          uVar16 = uStack_fe0;
          uVar15 = local_fe8;
          uVar14 = uStack_1000;
          uVar13 = local_1008;
          uVar12 = uStack_1020;
          uVar11 = local_1028;
          uVar10 = uStack_1040;
          uVar9 = local_1048;
          uVar8 = uStack_10e0;
          uVar7 = local_10e8;
          uVar6 = uStack_1100;
          uVar5 = local_1108;
          uVar4 = uStack_1120;
          uVar3 = local_1128;
          uVar2 = uStack_1140;
          uVar1 = local_1148;
          local_fe8._0_4_ = (int)local_1b68;
          local_fe8._4_4_ = (int)((ulong)local_1b68 >> 0x20);
          uStack_fe0._0_4_ = (int)uStack_1b60;
          uStack_fe0._4_4_ = (int)((ulong)uStack_1b60 >> 0x20);
          local_1008._0_4_ = (int)local_1b78;
          local_1008._4_4_ = (int)((ulong)local_1b78 >> 0x20);
          uStack_1000._0_4_ = (int)uStack_1b70;
          uStack_1000._4_4_ = (int)((ulong)uStack_1b70 >> 0x20);
          local_1028._0_4_ = (int)local_1b88;
          local_1028._4_4_ = (int)((ulong)local_1b88 >> 0x20);
          uStack_1020._0_4_ = (int)uStack_1b80;
          uStack_1020._4_4_ = (int)((ulong)uStack_1b80 >> 0x20);
          local_1048._0_4_ = (int)local_1b98;
          local_1048._4_4_ = (int)((ulong)local_1b98 >> 0x20);
          uStack_1040._0_4_ = (int)uStack_1b90;
          uStack_1040._4_4_ = (int)((ulong)uStack_1b90 >> 0x20);
          local_10e8._0_4_ = (int)local_1ba8;
          local_10e8._4_4_ = (int)((ulong)local_1ba8 >> 0x20);
          uStack_10e0._0_4_ = (int)uStack_1ba0;
          uStack_10e0._4_4_ = (int)((ulong)uStack_1ba0 >> 0x20);
          local_1108._0_4_ = (int)local_1bb8;
          local_1108._4_4_ = (int)((ulong)local_1bb8 >> 0x20);
          uStack_1100._0_4_ = (int)uStack_1bb0;
          uStack_1100._4_4_ = (int)((ulong)uStack_1bb0 >> 0x20);
          local_1128._0_4_ = (int)local_1bc8;
          local_1128._4_4_ = (int)((ulong)local_1bc8 >> 0x20);
          uStack_1120._0_4_ = (int)uStack_1bc0;
          uStack_1120._4_4_ = (int)((ulong)uStack_1bc0 >> 0x20);
          local_1148._0_4_ = (int)local_1bd8;
          local_1148._4_4_ = (int)((ulong)local_1bd8 >> 0x20);
          uStack_1140._0_4_ = (int)uStack_1bd0;
          uStack_1140._4_4_ = (int)((ulong)uStack_1bd0 >> 0x20);
          if (local_1b4c <= local_1bdc) break;
          local_cf8 = local_1ab0;
          local_1bf8 = *local_1ab0;
          lStack_1bf0 = local_1ab0[1];
          local_bc8 = 0;
          uStack_bc0 = 0;
          local_a88 = 0;
          uStack_a80 = 0;
          local_a98._0_1_ = (char)local_1bf8;
          local_a98._1_1_ = (char)((ulong)local_1bf8 >> 8);
          local_a98._2_1_ = (char)((ulong)local_1bf8 >> 0x10);
          local_a98._3_1_ = (char)((ulong)local_1bf8 >> 0x18);
          local_a98._4_1_ = (char)((ulong)local_1bf8 >> 0x20);
          local_a98._5_1_ = (char)((ulong)local_1bf8 >> 0x28);
          local_a98._6_1_ = (char)((ulong)local_1bf8 >> 0x30);
          local_a98._7_1_ = (undefined1)((ulong)local_1bf8 >> 0x38);
          uStack_a90._0_1_ = (char)lStack_1bf0;
          uStack_a90._1_1_ = (char)((ulong)lStack_1bf0 >> 8);
          uStack_a90._2_1_ = (char)((ulong)lStack_1bf0 >> 0x10);
          uStack_a90._3_1_ = (char)((ulong)lStack_1bf0 >> 0x18);
          uStack_a90._4_1_ = (char)((ulong)lStack_1bf0 >> 0x20);
          uStack_a90._5_1_ = (char)((ulong)lStack_1bf0 >> 0x28);
          uStack_a90._6_1_ = (char)((ulong)lStack_1bf0 >> 0x30);
          uStack_a90._7_1_ = (undefined1)((ulong)lStack_1bf0 >> 0x38);
          local_1c08 = CONCAT17(-(local_1bf8 < 0),
                                CONCAT16(-(local_a98._6_1_ < '\0'),
                                         CONCAT15(-(local_a98._5_1_ < '\0'),
                                                  CONCAT14(-(local_a98._4_1_ < '\0'),
                                                           CONCAT13(-(local_a98._3_1_ < '\0'),
                                                                    CONCAT12(-(local_a98._2_1_ <
                                                                              '\0'),CONCAT11(-(
                                                  local_a98._1_1_ < '\0'),-((char)local_a98 < '\0'))
                                                  ))))));
          uStack_1c00 = CONCAT17(-(lStack_1bf0 < 0),
                                 CONCAT16(-(uStack_a90._6_1_ < '\0'),
                                          CONCAT15(-(uStack_a90._5_1_ < '\0'),
                                                   CONCAT14(-(uStack_a90._4_1_ < '\0'),
                                                            CONCAT13(-(uStack_a90._3_1_ < '\0'),
                                                                     CONCAT12(-(uStack_a90._2_1_ <
                                                                               '\0'),CONCAT11(-(
                                                  uStack_a90._1_1_ < '\0'),
                                                  -((char)uStack_a90 < '\0'))))))));
          sVar71 = CONCAT11(-((char)local_a98 < '\0'),(char)local_a98);
          uVar72 = CONCAT13(-(local_a98._1_1_ < '\0'),CONCAT12(local_a98._1_1_,sVar71));
          uVar73 = CONCAT15(-(local_a98._2_1_ < '\0'),CONCAT14(local_a98._2_1_,uVar72));
          local_1c18 = CONCAT17(-(local_a98._3_1_ < '\0'),CONCAT16(local_a98._3_1_,uVar73));
          sVar74 = CONCAT11(-(local_a98._4_1_ < '\0'),local_a98._4_1_);
          uVar75 = CONCAT13(-(local_a98._5_1_ < '\0'),CONCAT12(local_a98._5_1_,sVar74));
          uVar76 = CONCAT15(-(local_a98._6_1_ < '\0'),CONCAT14(local_a98._6_1_,uVar75));
          uStack_1c10 = CONCAT17(-(local_1bf8 < 0),CONCAT16(local_a98._7_1_,uVar76));
          sVar95 = CONCAT11(-((char)uStack_a90 < '\0'),(char)uStack_a90);
          uVar43 = CONCAT13(-(uStack_a90._1_1_ < '\0'),CONCAT12(uStack_a90._1_1_,sVar95));
          uVar44 = CONCAT15(-(uStack_a90._2_1_ < '\0'),CONCAT14(uStack_a90._2_1_,uVar43));
          local_1c28 = CONCAT17(-(uStack_a90._3_1_ < '\0'),CONCAT16(uStack_a90._3_1_,uVar44));
          sVar109 = CONCAT11(-(uStack_a90._4_1_ < '\0'),uStack_a90._4_1_);
          uVar45 = CONCAT13(-(uStack_a90._5_1_ < '\0'),CONCAT12(uStack_a90._5_1_,sVar109));
          uVar46 = CONCAT15(-(uStack_a90._6_1_ < '\0'),CONCAT14(uStack_a90._6_1_,uVar45));
          uStack_1c20 = CONCAT17(-(lStack_1bf0 < 0),CONCAT16(uStack_a90._7_1_,uVar46));
          local_d00 = local_1b00;
          local_1c38 = *local_1b00;
          lStack_1c30 = local_1b00[1];
          local_d08 = local_1b00 + 2;
          local_1c48 = *local_d08;
          lStack_1c40 = local_1b00[3];
          local_bd8 = 0;
          uStack_bd0 = 0;
          local_aa8 = 0;
          uStack_aa0 = 0;
          local_ab8._0_1_ = (char)local_1c38;
          local_ab8._1_1_ = (char)((ulong)local_1c38 >> 8);
          local_ab8._2_1_ = (char)((ulong)local_1c38 >> 0x10);
          local_ab8._3_1_ = (char)((ulong)local_1c38 >> 0x18);
          local_ab8._4_1_ = (char)((ulong)local_1c38 >> 0x20);
          local_ab8._5_1_ = (char)((ulong)local_1c38 >> 0x28);
          local_ab8._6_1_ = (char)((ulong)local_1c38 >> 0x30);
          local_ab8._7_1_ = (undefined1)((ulong)local_1c38 >> 0x38);
          uStack_ab0._0_1_ = (char)lStack_1c30;
          uStack_ab0._1_1_ = (char)((ulong)lStack_1c30 >> 8);
          uStack_ab0._2_1_ = (char)((ulong)lStack_1c30 >> 0x10);
          uStack_ab0._3_1_ = (char)((ulong)lStack_1c30 >> 0x18);
          uStack_ab0._4_1_ = (char)((ulong)lStack_1c30 >> 0x20);
          uStack_ab0._5_1_ = (char)((ulong)lStack_1c30 >> 0x28);
          uStack_ab0._6_1_ = (char)((ulong)lStack_1c30 >> 0x30);
          uStack_ab0._7_1_ = (undefined1)((ulong)lStack_1c30 >> 0x38);
          local_1c58 = CONCAT17(-(local_1c38 < 0),
                                CONCAT16(-(local_ab8._6_1_ < '\0'),
                                         CONCAT15(-(local_ab8._5_1_ < '\0'),
                                                  CONCAT14(-(local_ab8._4_1_ < '\0'),
                                                           CONCAT13(-(local_ab8._3_1_ < '\0'),
                                                                    CONCAT12(-(local_ab8._2_1_ <
                                                                              '\0'),CONCAT11(-(
                                                  local_ab8._1_1_ < '\0'),-((char)local_ab8 < '\0'))
                                                  ))))));
          uStack_1c50 = CONCAT17(-(lStack_1c30 < 0),
                                 CONCAT16(-(uStack_ab0._6_1_ < '\0'),
                                          CONCAT15(-(uStack_ab0._5_1_ < '\0'),
                                                   CONCAT14(-(uStack_ab0._4_1_ < '\0'),
                                                            CONCAT13(-(uStack_ab0._3_1_ < '\0'),
                                                                     CONCAT12(-(uStack_ab0._2_1_ <
                                                                               '\0'),CONCAT11(-(
                                                  uStack_ab0._1_1_ < '\0'),
                                                  -((char)uStack_ab0 < '\0'))))))));
          local_be8 = 0;
          uStack_be0 = 0;
          local_ac8 = 0;
          uStack_ac0 = 0;
          local_ad8._0_1_ = (char)local_1c48;
          local_ad8._1_1_ = (char)((ulong)local_1c48 >> 8);
          local_ad8._2_1_ = (char)((ulong)local_1c48 >> 0x10);
          local_ad8._3_1_ = (char)((ulong)local_1c48 >> 0x18);
          local_ad8._4_1_ = (char)((ulong)local_1c48 >> 0x20);
          local_ad8._5_1_ = (char)((ulong)local_1c48 >> 0x28);
          local_ad8._6_1_ = (char)((ulong)local_1c48 >> 0x30);
          local_ad8._7_1_ = (undefined1)((ulong)local_1c48 >> 0x38);
          uStack_ad0._0_1_ = (char)lStack_1c40;
          uStack_ad0._1_1_ = (char)((ulong)lStack_1c40 >> 8);
          uStack_ad0._2_1_ = (char)((ulong)lStack_1c40 >> 0x10);
          uStack_ad0._3_1_ = (char)((ulong)lStack_1c40 >> 0x18);
          uStack_ad0._4_1_ = (char)((ulong)lStack_1c40 >> 0x20);
          uStack_ad0._5_1_ = (char)((ulong)lStack_1c40 >> 0x28);
          uStack_ad0._6_1_ = (char)((ulong)lStack_1c40 >> 0x30);
          uStack_ad0._7_1_ = (undefined1)((ulong)lStack_1c40 >> 0x38);
          local_1c68 = CONCAT17(-(local_1c48 < 0),
                                CONCAT16(-(local_ad8._6_1_ < '\0'),
                                         CONCAT15(-(local_ad8._5_1_ < '\0'),
                                                  CONCAT14(-(local_ad8._4_1_ < '\0'),
                                                           CONCAT13(-(local_ad8._3_1_ < '\0'),
                                                                    CONCAT12(-(local_ad8._2_1_ <
                                                                              '\0'),CONCAT11(-(
                                                  local_ad8._1_1_ < '\0'),-((char)local_ad8 < '\0'))
                                                  ))))));
          uStack_1c60 = CONCAT17(-(lStack_1c40 < 0),
                                 CONCAT16(-(uStack_ad0._6_1_ < '\0'),
                                          CONCAT15(-(uStack_ad0._5_1_ < '\0'),
                                                   CONCAT14(-(uStack_ad0._4_1_ < '\0'),
                                                            CONCAT13(-(uStack_ad0._3_1_ < '\0'),
                                                                     CONCAT12(-(uStack_ad0._2_1_ <
                                                                               '\0'),CONCAT11(-(
                                                  uStack_ad0._1_1_ < '\0'),
                                                  -((char)uStack_ad0 < '\0'))))))));
          sVar92 = CONCAT11(-((char)local_ab8 < '\0'),(char)local_ab8);
          uVar39 = CONCAT13(-(local_ab8._1_1_ < '\0'),CONCAT12(local_ab8._1_1_,sVar92));
          uVar40 = CONCAT15(-(local_ab8._2_1_ < '\0'),CONCAT14(local_ab8._2_1_,uVar39));
          local_1c78 = CONCAT17(-(local_ab8._3_1_ < '\0'),CONCAT16(local_ab8._3_1_,uVar40));
          sVar106 = CONCAT11(-(local_ab8._4_1_ < '\0'),local_ab8._4_1_);
          uVar41 = CONCAT13(-(local_ab8._5_1_ < '\0'),CONCAT12(local_ab8._5_1_,sVar106));
          uVar42 = CONCAT15(-(local_ab8._6_1_ < '\0'),CONCAT14(local_ab8._6_1_,uVar41));
          uStack_1c70 = CONCAT17(-(local_1c38 < 0),CONCAT16(local_ab8._7_1_,uVar42));
          sVar93 = CONCAT11(-((char)uStack_ab0 < '\0'),(char)uStack_ab0);
          uVar35 = CONCAT13(-(uStack_ab0._1_1_ < '\0'),CONCAT12(uStack_ab0._1_1_,sVar93));
          uVar36 = CONCAT15(-(uStack_ab0._2_1_ < '\0'),CONCAT14(uStack_ab0._2_1_,uVar35));
          local_1c88 = CONCAT17(-(uStack_ab0._3_1_ < '\0'),CONCAT16(uStack_ab0._3_1_,uVar36));
          sVar107 = CONCAT11(-(uStack_ab0._4_1_ < '\0'),uStack_ab0._4_1_);
          uVar37 = CONCAT13(-(uStack_ab0._5_1_ < '\0'),CONCAT12(uStack_ab0._5_1_,sVar107));
          uVar38 = CONCAT15(-(uStack_ab0._6_1_ < '\0'),CONCAT14(uStack_ab0._6_1_,uVar37));
          uStack_1c80 = CONCAT17(-(lStack_1c30 < 0),CONCAT16(uStack_ab0._7_1_,uVar38));
          sVar94 = CONCAT11(-((char)local_ad8 < '\0'),(char)local_ad8);
          uVar31 = CONCAT13(-(local_ad8._1_1_ < '\0'),CONCAT12(local_ad8._1_1_,sVar94));
          uVar32 = CONCAT15(-(local_ad8._2_1_ < '\0'),CONCAT14(local_ad8._2_1_,uVar31));
          local_1c98 = CONCAT17(-(local_ad8._3_1_ < '\0'),CONCAT16(local_ad8._3_1_,uVar32));
          sVar108 = CONCAT11(-(local_ad8._4_1_ < '\0'),local_ad8._4_1_);
          uVar33 = CONCAT13(-(local_ad8._5_1_ < '\0'),CONCAT12(local_ad8._5_1_,sVar108));
          uVar34 = CONCAT15(-(local_ad8._6_1_ < '\0'),CONCAT14(local_ad8._6_1_,uVar33));
          uStack_1c90 = CONCAT17(-(local_1c48 < 0),CONCAT16(local_ad8._7_1_,uVar34));
          sVar25 = CONCAT11(-((char)uStack_ad0 < '\0'),(char)uStack_ad0);
          uVar26 = CONCAT13(-(uStack_ad0._1_1_ < '\0'),CONCAT12(uStack_ad0._1_1_,sVar25));
          uVar27 = CONCAT15(-(uStack_ad0._2_1_ < '\0'),CONCAT14(uStack_ad0._2_1_,uVar26));
          local_1ca8 = CONCAT17(-(uStack_ad0._3_1_ < '\0'),CONCAT16(uStack_ad0._3_1_,uVar27));
          sVar28 = CONCAT11(-(uStack_ad0._4_1_ < '\0'),uStack_ad0._4_1_);
          uVar29 = CONCAT13(-(uStack_ad0._5_1_ < '\0'),CONCAT12(uStack_ad0._5_1_,sVar28));
          uVar30 = CONCAT15(-(uStack_ad0._6_1_ < '\0'),CONCAT14(uStack_ad0._6_1_,uVar29));
          uStack_1ca0 = CONCAT17(-(lStack_1c40 < 0),CONCAT16(uStack_ad0._7_1_,uVar30));
          local_7a8._2_2_ = (short)((uint)uVar72 >> 0x10);
          local_7a8._4_2_ = (short)((uint6)uVar73 >> 0x20);
          local_7a8._6_2_ = (short)((ulong)local_1c18 >> 0x30);
          uStack_7a0._2_2_ = (short)((uint)uVar75 >> 0x10);
          uStack_7a0._4_2_ = (short)((uint6)uVar76 >> 0x20);
          uStack_7a0._6_2_ = (short)((ulong)uStack_1c10 >> 0x30);
          local_7b8._2_2_ = (short)((uint)uVar39 >> 0x10);
          local_7b8._4_2_ = (short)((uint6)uVar40 >> 0x20);
          local_7b8._6_2_ = (short)((ulong)local_1c78 >> 0x30);
          uStack_7b0._2_2_ = (short)((uint)uVar41 >> 0x10);
          uStack_7b0._4_2_ = (short)((uint6)uVar42 >> 0x20);
          uStack_7b0._6_2_ = (short)((ulong)uStack_1c70 >> 0x30);
          local_1cb8 = CONCAT26(local_7a8._6_2_ * local_7b8._6_2_,
                                CONCAT24(local_7a8._4_2_ * local_7b8._4_2_,
                                         CONCAT22(local_7a8._2_2_ * local_7b8._2_2_,sVar71 * sVar92)
                                        ));
          uStack_1cb0 = CONCAT26(uStack_7a0._6_2_ * uStack_7b0._6_2_,
                                 CONCAT24(uStack_7a0._4_2_ * uStack_7b0._4_2_,
                                          CONCAT22(uStack_7a0._2_2_ * uStack_7b0._2_2_,
                                                   sVar74 * sVar106)));
          auVar90._8_8_ = uStack_1c10;
          auVar90._0_8_ = local_1c18;
          auVar96._8_8_ = uStack_1c70;
          auVar96._0_8_ = local_1c78;
          auVar96 = pmulhw(auVar90,auVar96);
          local_2358 = auVar96._0_8_;
          local_1cc8 = local_2358;
          uStack_2350 = auVar96._8_8_;
          uStack_1cc0 = uStack_2350;
          local_7d8._2_2_ = (short)((uint)uVar35 >> 0x10);
          local_7d8._4_2_ = (short)((uint6)uVar36 >> 0x20);
          local_7d8._6_2_ = (short)((ulong)local_1c88 >> 0x30);
          uStack_7d0._2_2_ = (short)((uint)uVar37 >> 0x10);
          uStack_7d0._4_2_ = (short)((uint6)uVar38 >> 0x20);
          uStack_7d0._6_2_ = (short)((ulong)uStack_1c80 >> 0x30);
          local_1cd8 = CONCAT26(local_7a8._6_2_ * local_7d8._6_2_,
                                CONCAT24(local_7a8._4_2_ * local_7d8._4_2_,
                                         CONCAT22(local_7a8._2_2_ * local_7d8._2_2_,sVar71 * sVar93)
                                        ));
          uStack_1cd0 = CONCAT26(uStack_7a0._6_2_ * uStack_7d0._6_2_,
                                 CONCAT24(uStack_7a0._4_2_ * uStack_7d0._4_2_,
                                          CONCAT22(uStack_7a0._2_2_ * uStack_7d0._2_2_,
                                                   sVar74 * sVar107)));
          auVar89._8_8_ = uStack_1c10;
          auVar89._0_8_ = local_1c18;
          auVar97._8_8_ = uStack_1c80;
          auVar97._0_8_ = local_1c88;
          auVar97 = pmulhw(auVar89,auVar97);
          local_2378 = auVar97._0_8_;
          local_1ce8 = local_2378;
          uStack_2370 = auVar97._8_8_;
          uStack_1ce0 = uStack_2370;
          local_7f8._2_2_ = (short)((uint)uVar31 >> 0x10);
          local_7f8._4_2_ = (short)((uint6)uVar32 >> 0x20);
          local_7f8._6_2_ = (short)((ulong)local_1c98 >> 0x30);
          uStack_7f0._2_2_ = (short)((uint)uVar33 >> 0x10);
          uStack_7f0._4_2_ = (short)((uint6)uVar34 >> 0x20);
          uStack_7f0._6_2_ = (short)((ulong)uStack_1c90 >> 0x30);
          local_1cf8 = CONCAT26(local_7a8._6_2_ * local_7f8._6_2_,
                                CONCAT24(local_7a8._4_2_ * local_7f8._4_2_,
                                         CONCAT22(local_7a8._2_2_ * local_7f8._2_2_,sVar71 * sVar94)
                                        ));
          uStack_1cf0 = CONCAT26(uStack_7a0._6_2_ * uStack_7f0._6_2_,
                                 CONCAT24(uStack_7a0._4_2_ * uStack_7f0._4_2_,
                                          CONCAT22(uStack_7a0._2_2_ * uStack_7f0._2_2_,
                                                   sVar74 * sVar108)));
          auVar88._8_8_ = uStack_1c10;
          auVar88._0_8_ = local_1c18;
          auVar98._8_8_ = uStack_1c90;
          auVar98._0_8_ = local_1c98;
          auVar98 = pmulhw(auVar88,auVar98);
          local_2398 = auVar98._0_8_;
          local_1d08 = local_2398;
          uStack_2390 = auVar98._8_8_;
          uStack_1d00 = uStack_2390;
          local_818._2_2_ = (short)((uint)uVar26 >> 0x10);
          local_818._4_2_ = (short)((uint6)uVar27 >> 0x20);
          local_818._6_2_ = (short)((ulong)local_1ca8 >> 0x30);
          uStack_810._2_2_ = (short)((uint)uVar29 >> 0x10);
          uStack_810._4_2_ = (short)((uint6)uVar30 >> 0x20);
          uStack_810._6_2_ = (short)((ulong)uStack_1ca0 >> 0x30);
          local_1d18 = CONCAT26(local_7a8._6_2_ * local_818._6_2_,
                                CONCAT24(local_7a8._4_2_ * local_818._4_2_,
                                         CONCAT22(local_7a8._2_2_ * local_818._2_2_,sVar71 * sVar25)
                                        ));
          uStack_1d10 = CONCAT26(uStack_7a0._6_2_ * uStack_810._6_2_,
                                 CONCAT24(uStack_7a0._4_2_ * uStack_810._4_2_,
                                          CONCAT22(uStack_7a0._2_2_ * uStack_810._2_2_,
                                                   sVar74 * sVar28)));
          auVar87._8_8_ = uStack_1c10;
          auVar87._0_8_ = local_1c18;
          auVar99._8_8_ = uStack_1ca0;
          auVar99._0_8_ = local_1ca8;
          auVar99 = pmulhw(auVar87,auVar99);
          local_23b8 = auVar99._0_8_;
          local_1d28 = local_23b8;
          uStack_23b0 = auVar99._8_8_;
          uStack_1d20 = uStack_23b0;
          local_828._2_2_ = (short)((uint)uVar43 >> 0x10);
          local_828._4_2_ = (short)((uint6)uVar44 >> 0x20);
          local_828._6_2_ = (short)((ulong)local_1c28 >> 0x30);
          uStack_820._2_2_ = (short)((uint)uVar45 >> 0x10);
          uStack_820._4_2_ = (short)((uint6)uVar46 >> 0x20);
          uStack_820._6_2_ = (short)((ulong)uStack_1c20 >> 0x30);
          local_1d38 = CONCAT26(local_828._6_2_ * local_7b8._6_2_,
                                CONCAT24(local_828._4_2_ * local_7b8._4_2_,
                                         CONCAT22(local_828._2_2_ * local_7b8._2_2_,sVar95 * sVar92)
                                        ));
          uStack_1d30 = CONCAT26(uStack_820._6_2_ * uStack_7b0._6_2_,
                                 CONCAT24(uStack_820._4_2_ * uStack_7b0._4_2_,
                                          CONCAT22(uStack_820._2_2_ * uStack_7b0._2_2_,
                                                   sVar109 * sVar106)));
          auVar86._8_8_ = uStack_1c20;
          auVar86._0_8_ = local_1c28;
          auVar100._8_8_ = uStack_1c70;
          auVar100._0_8_ = local_1c78;
          auVar100 = pmulhw(auVar86,auVar100);
          local_23d8 = auVar100._0_8_;
          local_1d48 = local_23d8;
          uStack_23d0 = auVar100._8_8_;
          uStack_1d40 = uStack_23d0;
          local_1d58 = CONCAT26(local_828._6_2_ * local_7d8._6_2_,
                                CONCAT24(local_828._4_2_ * local_7d8._4_2_,
                                         CONCAT22(local_828._2_2_ * local_7d8._2_2_,sVar95 * sVar93)
                                        ));
          uStack_1d50 = CONCAT26(uStack_820._6_2_ * uStack_7d0._6_2_,
                                 CONCAT24(uStack_820._4_2_ * uStack_7d0._4_2_,
                                          CONCAT22(uStack_820._2_2_ * uStack_7d0._2_2_,
                                                   sVar109 * sVar107)));
          auVar85._8_8_ = uStack_1c20;
          auVar85._0_8_ = local_1c28;
          auVar101._8_8_ = uStack_1c80;
          auVar101._0_8_ = local_1c88;
          auVar101 = pmulhw(auVar85,auVar101);
          local_23f8 = auVar101._0_8_;
          local_1d68 = local_23f8;
          uStack_23f0 = auVar101._8_8_;
          uStack_1d60 = uStack_23f0;
          local_1d78 = CONCAT26(local_828._6_2_ * local_7f8._6_2_,
                                CONCAT24(local_828._4_2_ * local_7f8._4_2_,
                                         CONCAT22(local_828._2_2_ * local_7f8._2_2_,sVar95 * sVar94)
                                        ));
          uStack_1d70 = CONCAT26(uStack_820._6_2_ * uStack_7f0._6_2_,
                                 CONCAT24(uStack_820._4_2_ * uStack_7f0._4_2_,
                                          CONCAT22(uStack_820._2_2_ * uStack_7f0._2_2_,
                                                   sVar109 * sVar108)));
          auVar105._8_8_ = uStack_1c20;
          auVar105._0_8_ = local_1c28;
          auVar102._8_8_ = uStack_1c90;
          auVar102._0_8_ = local_1c98;
          auVar102 = pmulhw(auVar105,auVar102);
          local_2418 = auVar102._0_8_;
          local_1d88 = local_2418;
          uStack_2410 = auVar102._8_8_;
          uStack_1d80 = uStack_2410;
          local_1d98 = CONCAT26(local_828._6_2_ * local_818._6_2_,
                                CONCAT24(local_828._4_2_ * local_818._4_2_,
                                         CONCAT22(local_828._2_2_ * local_818._2_2_,sVar95 * sVar25)
                                        ));
          uStack_1d90 = CONCAT26(uStack_820._6_2_ * uStack_810._6_2_,
                                 CONCAT24(uStack_820._4_2_ * uStack_810._4_2_,
                                          CONCAT22(uStack_820._2_2_ * uStack_810._2_2_,
                                                   sVar109 * sVar28)));
          auVar104._8_8_ = uStack_1c20;
          auVar104._0_8_ = local_1c28;
          auVar103._8_8_ = uStack_1ca0;
          auVar103._0_8_ = local_1ca8;
          auVar103 = pmulhw(auVar104,auVar103);
          local_2438 = auVar103._0_8_;
          local_1da8 = local_2438;
          uStack_2430 = auVar103._8_8_;
          uStack_1da0 = uStack_2430;
          uStack_4b0 = uStack_2350;
          local_4b8._0_2_ = auVar96._0_2_;
          local_4b8._2_2_ = auVar96._2_2_;
          local_4b8._4_2_ = auVar96._4_2_;
          local_4b8._6_2_ = auVar96._6_2_;
          iVar91 = CONCAT22((undefined2)local_4b8,sVar71 * sVar92);
          uVar69 = CONCAT26(local_4b8._2_2_,CONCAT24(local_7a8._2_2_ * local_7b8._2_2_,iVar91));
          iVar111 = CONCAT22(local_4b8._4_2_,local_7a8._4_2_ * local_7b8._4_2_);
          uVar70 = CONCAT26(local_4b8._6_2_,CONCAT24(local_7a8._6_2_ * local_7b8._6_2_,iVar111));
          uVar1 = local_1b68;
          uVar2 = uStack_1b60;
          local_ff8._4_4_ = (int)((ulong)uVar69 >> 0x20);
          uStack_ff0._4_4_ = (int)((ulong)uVar70 >> 0x20);
          local_fe8._0_4_ = (int)local_fe8 + iVar91;
          uStack_fe0._0_4_ = (int)uStack_fe0 + iVar111;
          local_1b68 = CONCAT44(local_fe8._4_4_ + local_ff8._4_4_,(int)local_fe8);
          uStack_1b60 = CONCAT44(uStack_fe0._4_4_ + uStack_ff0._4_4_,(int)uStack_fe0);
          uStack_4d0 = uStack_2370;
          local_4d8._0_2_ = auVar97._0_2_;
          local_4d8._2_2_ = auVar97._2_2_;
          local_4d8._4_2_ = auVar97._4_2_;
          local_4d8._6_2_ = auVar97._6_2_;
          iVar91 = CONCAT22((undefined2)local_4d8,sVar71 * sVar93);
          uVar67 = CONCAT26(local_4d8._2_2_,CONCAT24(local_7a8._2_2_ * local_7d8._2_2_,iVar91));
          iVar111 = CONCAT22(local_4d8._4_2_,local_7a8._4_2_ * local_7d8._4_2_);
          uVar68 = CONCAT26(local_4d8._6_2_,CONCAT24(local_7a8._6_2_ * local_7d8._6_2_,iVar111));
          uVar3 = local_1b78;
          uVar4 = uStack_1b70;
          local_1018._4_4_ = (int)((ulong)uVar67 >> 0x20);
          uStack_1010._4_4_ = (int)((ulong)uVar68 >> 0x20);
          local_1008._0_4_ = (int)local_1008 + iVar91;
          uStack_1000._0_4_ = (int)uStack_1000 + iVar111;
          local_1b78 = CONCAT44(local_1008._4_4_ + local_1018._4_4_,(int)local_1008);
          uStack_1b70 = CONCAT44(uStack_1000._4_4_ + uStack_1010._4_4_,(int)uStack_1000);
          uStack_4f0 = uStack_2390;
          local_4f8._0_2_ = auVar98._0_2_;
          local_4f8._2_2_ = auVar98._2_2_;
          local_4f8._4_2_ = auVar98._4_2_;
          local_4f8._6_2_ = auVar98._6_2_;
          iVar91 = CONCAT22((undefined2)local_4f8,sVar71 * sVar94);
          uVar65 = CONCAT26(local_4f8._2_2_,CONCAT24(local_7a8._2_2_ * local_7f8._2_2_,iVar91));
          iVar111 = CONCAT22(local_4f8._4_2_,local_7a8._4_2_ * local_7f8._4_2_);
          uVar66 = CONCAT26(local_4f8._6_2_,CONCAT24(local_7a8._6_2_ * local_7f8._6_2_,iVar111));
          uVar5 = local_1b88;
          uVar6 = uStack_1b80;
          local_1038._4_4_ = (int)((ulong)uVar65 >> 0x20);
          uStack_1030._4_4_ = (int)((ulong)uVar66 >> 0x20);
          local_1028._0_4_ = (int)local_1028 + iVar91;
          uStack_1020._0_4_ = (int)uStack_1020 + iVar111;
          local_1b88 = CONCAT44(local_1028._4_4_ + local_1038._4_4_,(int)local_1028);
          uStack_1b80 = CONCAT44(uStack_1020._4_4_ + uStack_1030._4_4_,(int)uStack_1020);
          uStack_510 = uStack_23b0;
          local_518._0_2_ = auVar99._0_2_;
          local_518._2_2_ = auVar99._2_2_;
          local_518._4_2_ = auVar99._4_2_;
          local_518._6_2_ = auVar99._6_2_;
          iVar91 = CONCAT22((undefined2)local_518,sVar71 * sVar25);
          uVar63 = CONCAT26(local_518._2_2_,CONCAT24(local_7a8._2_2_ * local_818._2_2_,iVar91));
          iVar111 = CONCAT22(local_518._4_2_,local_7a8._4_2_ * local_818._4_2_);
          uVar64 = CONCAT26(local_518._6_2_,CONCAT24(local_7a8._6_2_ * local_818._6_2_,iVar111));
          uVar7 = local_1b98;
          uVar8 = uStack_1b90;
          local_1058._4_4_ = (int)((ulong)uVar63 >> 0x20);
          uStack_1050._4_4_ = (int)((ulong)uVar64 >> 0x20);
          local_1048._0_4_ = (int)local_1048 + iVar91;
          uStack_1040._0_4_ = (int)uStack_1040 + iVar111;
          local_1b98 = CONCAT44(local_1048._4_4_ + local_1058._4_4_,(int)local_1048);
          uStack_1b90 = CONCAT44(uStack_1040._4_4_ + uStack_1050._4_4_,(int)uStack_1040);
          local_338 = local_2358;
          uStack_330._0_2_ = auVar96._8_2_;
          uStack_330._2_2_ = auVar96._10_2_;
          uStack_330._4_2_ = auVar96._12_2_;
          uStack_330._6_2_ = auVar96._14_2_;
          iVar91 = CONCAT22((undefined2)uStack_330,sVar74 * sVar106);
          uVar61 = CONCAT26(uStack_330._2_2_,CONCAT24(uStack_7a0._2_2_ * uStack_7b0._2_2_,iVar91));
          iVar111 = CONCAT22(uStack_330._4_2_,uStack_7a0._4_2_ * uStack_7b0._4_2_);
          uVar62 = CONCAT26(uStack_330._6_2_,CONCAT24(uStack_7a0._6_2_ * uStack_7b0._6_2_,iVar111));
          local_1068 = local_1b68;
          uStack_1060 = uStack_1b60;
          local_1078._4_4_ = (int)((ulong)uVar61 >> 0x20);
          uStack_1070._4_4_ = (int)((ulong)uVar62 >> 0x20);
          local_1b68 = CONCAT44(local_fe8._4_4_ + local_ff8._4_4_ + local_1078._4_4_,
                                (int)local_fe8 + iVar91);
          uStack_1b60 = CONCAT44(uStack_fe0._4_4_ + uStack_ff0._4_4_ + uStack_1070._4_4_,
                                 (int)uStack_fe0 + iVar111);
          local_358 = local_2378;
          uStack_350._0_2_ = auVar97._8_2_;
          uStack_350._2_2_ = auVar97._10_2_;
          uStack_350._4_2_ = auVar97._12_2_;
          uStack_350._6_2_ = auVar97._14_2_;
          iVar91 = CONCAT22((undefined2)uStack_350,sVar74 * sVar107);
          uVar59 = CONCAT26(uStack_350._2_2_,CONCAT24(uStack_7a0._2_2_ * uStack_7d0._2_2_,iVar91));
          iVar111 = CONCAT22(uStack_350._4_2_,uStack_7a0._4_2_ * uStack_7d0._4_2_);
          uVar60 = CONCAT26(uStack_350._6_2_,CONCAT24(uStack_7a0._6_2_ * uStack_7d0._6_2_,iVar111));
          local_1088 = local_1b78;
          uStack_1080 = uStack_1b70;
          local_1098._4_4_ = (int)((ulong)uVar59 >> 0x20);
          uStack_1090._4_4_ = (int)((ulong)uVar60 >> 0x20);
          local_1b78 = CONCAT44(local_1008._4_4_ + local_1018._4_4_ + local_1098._4_4_,
                                (int)local_1008 + iVar91);
          uStack_1b70 = CONCAT44(uStack_1000._4_4_ + uStack_1010._4_4_ + uStack_1090._4_4_,
                                 (int)uStack_1000 + iVar111);
          local_378 = local_2398;
          uStack_370._0_2_ = auVar98._8_2_;
          uStack_370._2_2_ = auVar98._10_2_;
          uStack_370._4_2_ = auVar98._12_2_;
          uStack_370._6_2_ = auVar98._14_2_;
          iVar91 = CONCAT22((undefined2)uStack_370,sVar74 * sVar108);
          uVar57 = CONCAT26(uStack_370._2_2_,CONCAT24(uStack_7a0._2_2_ * uStack_7f0._2_2_,iVar91));
          iVar111 = CONCAT22(uStack_370._4_2_,uStack_7a0._4_2_ * uStack_7f0._4_2_);
          uVar58 = CONCAT26(uStack_370._6_2_,CONCAT24(uStack_7a0._6_2_ * uStack_7f0._6_2_,iVar111));
          local_10a8 = local_1b88;
          uStack_10a0 = uStack_1b80;
          local_10b8._4_4_ = (int)((ulong)uVar57 >> 0x20);
          uStack_10b0._4_4_ = (int)((ulong)uVar58 >> 0x20);
          local_1b88 = CONCAT44(local_1028._4_4_ + local_1038._4_4_ + local_10b8._4_4_,
                                (int)local_1028 + iVar91);
          uStack_1b80 = CONCAT44(uStack_1020._4_4_ + uStack_1030._4_4_ + uStack_10b0._4_4_,
                                 (int)uStack_1020 + iVar111);
          local_398 = local_23b8;
          uStack_390._0_2_ = auVar99._8_2_;
          uStack_390._2_2_ = auVar99._10_2_;
          uStack_390._4_2_ = auVar99._12_2_;
          uStack_390._6_2_ = auVar99._14_2_;
          iVar91 = CONCAT22((undefined2)uStack_390,sVar74 * sVar28);
          uVar55 = CONCAT26(uStack_390._2_2_,CONCAT24(uStack_7a0._2_2_ * uStack_810._2_2_,iVar91));
          iVar111 = CONCAT22(uStack_390._4_2_,uStack_7a0._4_2_ * uStack_810._4_2_);
          uVar56 = CONCAT26(uStack_390._6_2_,CONCAT24(uStack_7a0._6_2_ * uStack_810._6_2_,iVar111));
          local_10c8 = local_1b98;
          uStack_10c0 = uStack_1b90;
          local_10d8._4_4_ = (int)((ulong)uVar55 >> 0x20);
          uStack_10d0._4_4_ = (int)((ulong)uVar56 >> 0x20);
          local_1b98 = CONCAT44(local_1048._4_4_ + local_1058._4_4_ + local_10d8._4_4_,
                                (int)local_1048 + iVar91);
          uStack_1b90 = CONCAT44(uStack_1040._4_4_ + uStack_1050._4_4_ + uStack_10d0._4_4_,
                                 (int)uStack_1040 + iVar111);
          uStack_530 = uStack_23d0;
          local_538._0_2_ = auVar100._0_2_;
          local_538._2_2_ = auVar100._2_2_;
          local_538._4_2_ = auVar100._4_2_;
          local_538._6_2_ = auVar100._6_2_;
          iVar91 = CONCAT22((undefined2)local_538,sVar95 * sVar92);
          uVar53 = CONCAT26(local_538._2_2_,CONCAT24(local_828._2_2_ * local_7b8._2_2_,iVar91));
          iVar111 = CONCAT22(local_538._4_2_,local_828._4_2_ * local_7b8._4_2_);
          uVar54 = CONCAT26(local_538._6_2_,CONCAT24(local_828._6_2_ * local_7b8._6_2_,iVar111));
          uVar9 = local_1ba8;
          uVar10 = uStack_1ba0;
          local_10f8._4_4_ = (int)((ulong)uVar53 >> 0x20);
          uStack_10f0._4_4_ = (int)((ulong)uVar54 >> 0x20);
          local_10e8._0_4_ = (int)local_10e8 + iVar91;
          uStack_10e0._0_4_ = (int)uStack_10e0 + iVar111;
          local_1ba8 = CONCAT44(local_10e8._4_4_ + local_10f8._4_4_,(int)local_10e8);
          uStack_1ba0 = CONCAT44(uStack_10e0._4_4_ + uStack_10f0._4_4_,(int)uStack_10e0);
          uStack_550 = uStack_23f0;
          local_558._0_2_ = auVar101._0_2_;
          local_558._2_2_ = auVar101._2_2_;
          local_558._4_2_ = auVar101._4_2_;
          local_558._6_2_ = auVar101._6_2_;
          iVar91 = CONCAT22((undefined2)local_558,sVar95 * sVar93);
          uVar51 = CONCAT26(local_558._2_2_,CONCAT24(local_828._2_2_ * local_7d8._2_2_,iVar91));
          iVar111 = CONCAT22(local_558._4_2_,local_828._4_2_ * local_7d8._4_2_);
          uVar52 = CONCAT26(local_558._6_2_,CONCAT24(local_828._6_2_ * local_7d8._6_2_,iVar111));
          uVar11 = local_1bb8;
          uVar12 = uStack_1bb0;
          local_1118._4_4_ = (int)((ulong)uVar51 >> 0x20);
          uStack_1110._4_4_ = (int)((ulong)uVar52 >> 0x20);
          local_1108._0_4_ = (int)local_1108 + iVar91;
          uStack_1100._0_4_ = (int)uStack_1100 + iVar111;
          local_1bb8 = CONCAT44(local_1108._4_4_ + local_1118._4_4_,(int)local_1108);
          uStack_1bb0 = CONCAT44(uStack_1100._4_4_ + uStack_1110._4_4_,(int)uStack_1100);
          uStack_570 = uStack_2410;
          local_578._0_2_ = auVar102._0_2_;
          local_578._2_2_ = auVar102._2_2_;
          local_578._4_2_ = auVar102._4_2_;
          local_578._6_2_ = auVar102._6_2_;
          iVar91 = CONCAT22((undefined2)local_578,sVar95 * sVar94);
          uVar49 = CONCAT26(local_578._2_2_,CONCAT24(local_828._2_2_ * local_7f8._2_2_,iVar91));
          iVar111 = CONCAT22(local_578._4_2_,local_828._4_2_ * local_7f8._4_2_);
          uVar50 = CONCAT26(local_578._6_2_,CONCAT24(local_828._6_2_ * local_7f8._6_2_,iVar111));
          uVar13 = local_1bc8;
          uVar14 = uStack_1bc0;
          local_1138._4_4_ = (int)((ulong)uVar49 >> 0x20);
          uStack_1130._4_4_ = (int)((ulong)uVar50 >> 0x20);
          local_1128._0_4_ = (int)local_1128 + iVar91;
          uStack_1120._0_4_ = (int)uStack_1120 + iVar111;
          local_1bc8 = CONCAT44(local_1128._4_4_ + local_1138._4_4_,(int)local_1128);
          uStack_1bc0 = CONCAT44(uStack_1120._4_4_ + uStack_1130._4_4_,(int)uStack_1120);
          uStack_590 = uStack_2430;
          local_598._0_2_ = auVar103._0_2_;
          local_598._2_2_ = auVar103._2_2_;
          local_598._4_2_ = auVar103._4_2_;
          local_598._6_2_ = auVar103._6_2_;
          iVar91 = CONCAT22((undefined2)local_598,sVar95 * sVar25);
          uVar47 = CONCAT26(local_598._2_2_,CONCAT24(local_828._2_2_ * local_818._2_2_,iVar91));
          iVar111 = CONCAT22(local_598._4_2_,local_828._4_2_ * local_818._4_2_);
          uVar48 = CONCAT26(local_598._6_2_,CONCAT24(local_828._6_2_ * local_818._6_2_,iVar111));
          uVar15 = local_1bd8;
          uVar16 = uStack_1bd0;
          local_1158._4_4_ = (int)((ulong)uVar47 >> 0x20);
          uStack_1150._4_4_ = (int)((ulong)uVar48 >> 0x20);
          local_1148._0_4_ = (int)local_1148 + iVar91;
          uStack_1140._0_4_ = (int)uStack_1140 + iVar111;
          local_1bd8 = CONCAT44(local_1148._4_4_ + local_1158._4_4_,(int)local_1148);
          uStack_1bd0 = CONCAT44(uStack_1140._4_4_ + uStack_1150._4_4_,(int)uStack_1140);
          local_3b8 = local_23d8;
          uStack_3b0._0_2_ = auVar100._8_2_;
          uStack_3b0._2_2_ = auVar100._10_2_;
          uStack_3b0._4_2_ = auVar100._12_2_;
          uStack_3b0._6_2_ = auVar100._14_2_;
          iVar91 = CONCAT22((undefined2)uStack_3b0,sVar109 * sVar106);
          uVar23 = CONCAT26(uStack_3b0._2_2_,CONCAT24(uStack_820._2_2_ * uStack_7b0._2_2_,iVar91));
          iVar111 = CONCAT22(uStack_3b0._4_2_,uStack_820._4_2_ * uStack_7b0._4_2_);
          uVar24 = CONCAT26(uStack_3b0._6_2_,CONCAT24(uStack_820._6_2_ * uStack_7b0._6_2_,iVar111));
          local_1168 = local_1ba8;
          uStack_1160 = uStack_1ba0;
          local_1178._4_4_ = (int)((ulong)uVar23 >> 0x20);
          uStack_1170._4_4_ = (int)((ulong)uVar24 >> 0x20);
          local_1ba8 = CONCAT44(local_10e8._4_4_ + local_10f8._4_4_ + local_1178._4_4_,
                                (int)local_10e8 + iVar91);
          uStack_1ba0 = CONCAT44(uStack_10e0._4_4_ + uStack_10f0._4_4_ + uStack_1170._4_4_,
                                 (int)uStack_10e0 + iVar111);
          local_3d8 = local_23f8;
          uStack_3d0._0_2_ = auVar101._8_2_;
          uStack_3d0._2_2_ = auVar101._10_2_;
          uStack_3d0._4_2_ = auVar101._12_2_;
          uStack_3d0._6_2_ = auVar101._14_2_;
          iVar91 = CONCAT22((undefined2)uStack_3d0,sVar109 * sVar107);
          uVar21 = CONCAT26(uStack_3d0._2_2_,CONCAT24(uStack_820._2_2_ * uStack_7d0._2_2_,iVar91));
          iVar111 = CONCAT22(uStack_3d0._4_2_,uStack_820._4_2_ * uStack_7d0._4_2_);
          uVar22 = CONCAT26(uStack_3d0._6_2_,CONCAT24(uStack_820._6_2_ * uStack_7d0._6_2_,iVar111));
          local_1188 = local_1bb8;
          uStack_1180 = uStack_1bb0;
          local_1198._4_4_ = (int)((ulong)uVar21 >> 0x20);
          uStack_1190._4_4_ = (int)((ulong)uVar22 >> 0x20);
          local_1bb8 = CONCAT44(local_1108._4_4_ + local_1118._4_4_ + local_1198._4_4_,
                                (int)local_1108 + iVar91);
          uStack_1bb0 = CONCAT44(uStack_1100._4_4_ + uStack_1110._4_4_ + uStack_1190._4_4_,
                                 (int)uStack_1100 + iVar111);
          local_3f8 = local_2418;
          uStack_3f0._0_2_ = auVar102._8_2_;
          uStack_3f0._2_2_ = auVar102._10_2_;
          uStack_3f0._4_2_ = auVar102._12_2_;
          uStack_3f0._6_2_ = auVar102._14_2_;
          iVar91 = CONCAT22((undefined2)uStack_3f0,sVar109 * sVar108);
          uVar19 = CONCAT26(uStack_3f0._2_2_,CONCAT24(uStack_820._2_2_ * uStack_7f0._2_2_,iVar91));
          iVar111 = CONCAT22(uStack_3f0._4_2_,uStack_820._4_2_ * uStack_7f0._4_2_);
          uVar20 = CONCAT26(uStack_3f0._6_2_,CONCAT24(uStack_820._6_2_ * uStack_7f0._6_2_,iVar111));
          local_11a8 = local_1bc8;
          uStack_11a0 = uStack_1bc0;
          local_11b8._4_4_ = (int)((ulong)uVar19 >> 0x20);
          uStack_11b0._4_4_ = (int)((ulong)uVar20 >> 0x20);
          local_1bc8 = CONCAT44(local_1128._4_4_ + local_1138._4_4_ + local_11b8._4_4_,
                                (int)local_1128 + iVar91);
          uStack_1bc0 = CONCAT44(uStack_1120._4_4_ + uStack_1130._4_4_ + uStack_11b0._4_4_,
                                 (int)uStack_1120 + iVar111);
          local_418 = local_2438;
          uStack_410._0_2_ = auVar103._8_2_;
          uStack_410._2_2_ = auVar103._10_2_;
          uStack_410._4_2_ = auVar103._12_2_;
          uStack_410._6_2_ = auVar103._14_2_;
          iVar91 = CONCAT22((undefined2)uStack_410,sVar109 * sVar28);
          uVar17 = CONCAT26(uStack_410._2_2_,CONCAT24(uStack_820._2_2_ * uStack_810._2_2_,iVar91));
          iVar111 = CONCAT22(uStack_410._4_2_,uStack_820._4_2_ * uStack_810._4_2_);
          uVar18 = CONCAT26(uStack_410._6_2_,CONCAT24(uStack_820._6_2_ * uStack_810._6_2_,iVar111));
          local_11c8 = local_1bd8;
          uStack_11c0 = uStack_1bd0;
          local_11d8._4_4_ = (int)((ulong)uVar17 >> 0x20);
          uStack_11d0._4_4_ = (int)((ulong)uVar18 >> 0x20);
          local_1bd8 = CONCAT44(local_1148._4_4_ + local_1158._4_4_ + local_11d8._4_4_,
                                (int)local_1148 + iVar91);
          uStack_1bd0 = CONCAT44(uStack_1140._4_4_ + uStack_1150._4_4_ + uStack_11d0._4_4_,
                                 (int)uStack_1140 + iVar111);
          local_1ab0 = local_1ab0 + 2;
          local_1b00 = local_1b00 + 4;
          local_1bdc = local_1bdc + 1;
          local_11d8 = uVar17;
          uStack_11d0 = uVar18;
          local_11b8 = uVar19;
          uStack_11b0 = uVar20;
          local_1198 = uVar21;
          uStack_1190 = uVar22;
          local_1178 = uVar23;
          uStack_1170 = uVar24;
          local_1158 = uVar47;
          uStack_1150 = uVar48;
          local_1148 = uVar15;
          uStack_1140 = uVar16;
          local_1138 = uVar49;
          uStack_1130 = uVar50;
          local_1128 = uVar13;
          uStack_1120 = uVar14;
          local_1118 = uVar51;
          uStack_1110 = uVar52;
          local_1108 = uVar11;
          uStack_1100 = uVar12;
          local_10f8 = uVar53;
          uStack_10f0 = uVar54;
          local_10e8 = uVar9;
          uStack_10e0 = uVar10;
          local_10d8 = uVar55;
          uStack_10d0 = uVar56;
          local_10b8 = uVar57;
          uStack_10b0 = uVar58;
          local_1098 = uVar59;
          uStack_1090 = uVar60;
          local_1078 = uVar61;
          uStack_1070 = uVar62;
          local_1058 = uVar63;
          uStack_1050 = uVar64;
          local_1048 = uVar7;
          uStack_1040 = uVar8;
          local_1038 = uVar65;
          uStack_1030 = uVar66;
          local_1028 = uVar5;
          uStack_1020 = uVar6;
          local_1018 = uVar67;
          uStack_1010 = uVar68;
          local_1008 = uVar3;
          uStack_1000 = uVar4;
          local_ff8 = uVar69;
          uStack_ff0 = uVar70;
          local_fe8 = uVar1;
          uStack_fe0 = uVar2;
          local_ad8 = local_1c48;
          uStack_ad0 = lStack_1c40;
          local_ab8 = local_1c38;
          uStack_ab0 = lStack_1c30;
          local_a98 = local_1bf8;
          uStack_a90 = lStack_1bf0;
          local_a18 = local_1c68;
          uStack_a10 = uStack_1c60;
          local_a08 = local_1c48;
          lStack_a00 = lStack_1c40;
          local_9f8 = local_1c58;
          uStack_9f0 = uStack_1c50;
          local_9e8 = local_1c38;
          lStack_9e0 = lStack_1c30;
          local_9d8 = local_1c08;
          uStack_9d0 = uStack_1c00;
          local_9c8 = local_1bf8;
          lStack_9c0 = lStack_1bf0;
          local_978 = local_1c68;
          uStack_970 = uStack_1c60;
          local_968 = local_1c48;
          lStack_960 = lStack_1c40;
          local_958 = local_1c58;
          uStack_950 = uStack_1c50;
          local_948 = local_1c38;
          lStack_940 = lStack_1c30;
          local_938 = local_1c08;
          uStack_930 = uStack_1c00;
          local_928 = local_1bf8;
          lStack_920 = lStack_1bf0;
          local_898 = local_1ca8;
          uStack_890 = uStack_1ca0;
          local_888 = local_1c28;
          uStack_880 = uStack_1c20;
          local_878 = local_1c98;
          uStack_870 = uStack_1c90;
          local_868 = local_1c28;
          uStack_860 = uStack_1c20;
          local_858 = local_1c88;
          uStack_850 = uStack_1c80;
          local_848 = local_1c28;
          uStack_840 = uStack_1c20;
          local_838 = local_1c78;
          uStack_830 = uStack_1c70;
          local_828 = local_1c28;
          uStack_820 = uStack_1c20;
          local_818 = local_1ca8;
          uStack_810 = uStack_1ca0;
          local_808 = local_1c18;
          uStack_800 = uStack_1c10;
          local_7f8 = local_1c98;
          uStack_7f0 = uStack_1c90;
          local_7e8 = local_1c18;
          uStack_7e0 = uStack_1c10;
          local_7d8 = local_1c88;
          uStack_7d0 = uStack_1c80;
          local_7c8 = local_1c18;
          uStack_7c0 = uStack_1c10;
          local_7b8 = local_1c78;
          uStack_7b0 = uStack_1c70;
          local_7a8 = local_1c18;
          uStack_7a0 = uStack_1c10;
          local_718 = local_1ca8;
          uStack_710 = uStack_1ca0;
          local_708 = local_1c28;
          uStack_700 = uStack_1c20;
          local_6f8 = local_1c98;
          uStack_6f0 = uStack_1c90;
          local_6e8 = local_1c28;
          uStack_6e0 = uStack_1c20;
          local_6d8 = local_1c88;
          uStack_6d0 = uStack_1c80;
          local_6c8 = local_1c28;
          uStack_6c0 = uStack_1c20;
          local_6b8 = local_1c78;
          uStack_6b0 = uStack_1c70;
          local_6a8 = local_1c28;
          uStack_6a0 = uStack_1c20;
          local_698 = local_1ca8;
          uStack_690 = uStack_1ca0;
          local_688 = local_1c18;
          uStack_680 = uStack_1c10;
          local_678 = local_1c98;
          uStack_670 = uStack_1c90;
          local_668 = local_1c18;
          uStack_660 = uStack_1c10;
          local_658 = local_1c88;
          uStack_650 = uStack_1c80;
          local_648 = local_1c18;
          uStack_640 = uStack_1c10;
          local_638 = local_1c78;
          uStack_630 = uStack_1c70;
          local_628 = local_1c18;
          uStack_620 = uStack_1c10;
          local_598 = local_2438;
          local_588 = local_1d98;
          uStack_580 = uStack_1d90;
          local_578 = local_2418;
          local_568 = local_1d78;
          uStack_560 = uStack_1d70;
          local_558 = local_23f8;
          local_548 = local_1d58;
          uStack_540 = uStack_1d50;
          local_538 = local_23d8;
          local_528 = local_1d38;
          uStack_520 = uStack_1d30;
          local_518 = local_23b8;
          local_508 = local_1d18;
          uStack_500 = uStack_1d10;
          local_4f8 = local_2398;
          local_4e8 = local_1cf8;
          uStack_4e0 = uStack_1cf0;
          local_4d8 = local_2378;
          local_4c8 = local_1cd8;
          uStack_4c0 = uStack_1cd0;
          local_4b8 = local_2358;
          local_4a8 = local_1cb8;
          uStack_4a0 = uStack_1cb0;
          uStack_410 = uStack_2430;
          local_408 = local_1d98;
          uStack_400 = uStack_1d90;
          uStack_3f0 = uStack_2410;
          local_3e8 = local_1d78;
          uStack_3e0 = uStack_1d70;
          uStack_3d0 = uStack_23f0;
          local_3c8 = local_1d58;
          uStack_3c0 = uStack_1d50;
          uStack_3b0 = uStack_23d0;
          local_3a8 = local_1d38;
          uStack_3a0 = uStack_1d30;
          uStack_390 = uStack_23b0;
          local_388 = local_1d18;
          uStack_380 = uStack_1d10;
          uStack_370 = uStack_2390;
          local_368 = local_1cf8;
          uStack_360 = uStack_1cf0;
          uStack_350 = uStack_2370;
          local_348 = local_1cd8;
          uStack_340 = uStack_1cd0;
          uStack_330 = uStack_2350;
          local_328 = local_1cb8;
          uStack_320 = uStack_1cb0;
        }
        local_268 = local_1b68;
        uStack_260 = uStack_1b60;
        local_278 = local_1b78;
        uStack_270 = uStack_1b70;
        local_1db8 = CONCAT44((int)local_1008,(int)local_fe8);
        uStack_1db0 = CONCAT44(local_1008._4_4_,local_fe8._4_4_);
        local_288 = local_1b88;
        uStack_280 = uStack_1b80;
        local_298 = local_1b98;
        uStack_290 = uStack_1b90;
        local_1dc8 = CONCAT44((int)local_1048,(int)local_1028);
        uStack_1dc0 = CONCAT44(local_1048._4_4_,local_1028._4_4_);
        local_1a8 = local_1b68;
        uStack_1a0 = uStack_1b60;
        local_1b8 = local_1b78;
        uStack_1b0 = uStack_1b70;
        local_1dd8 = CONCAT44((int)uStack_1000,(int)uStack_fe0);
        uStack_1dd0 = CONCAT44(uStack_1000._4_4_,uStack_fe0._4_4_);
        local_1c8 = local_1b88;
        uStack_1c0 = uStack_1b80;
        local_1d8 = local_1b98;
        uStack_1d0 = uStack_1b90;
        local_1de8 = CONCAT44((int)uStack_1040,(int)uStack_1020);
        uStack_1de0 = CONCAT44(uStack_1040._4_4_,uStack_1020._4_4_);
        iStack_1c = local_1008._4_4_;
        iStack_2c = local_1048._4_4_;
        local_18 = CONCAT44(local_18._4_4_,(undefined4)local_1da8);
        _local_28 = CONCAT44((int)local_1008,(int)local_fe8);
        uStack_1b70 = CONCAT44(local_1008._4_4_,iStack_20);
        iStack_3c = uStack_1000._4_4_;
        iStack_4c = uStack_1040._4_4_;
        _local_38 = CONCAT44((int)local_1048,(int)local_1028);
        _local_48 = CONCAT44((int)uStack_1000,(int)uStack_fe0);
        uStack_1b90 = CONCAT44(uStack_1000._4_4_,iStack_40);
        local_2a8 = local_1ba8;
        uStack_2a0 = uStack_1ba0;
        local_2b8 = local_1bb8;
        uStack_2b0 = uStack_1bb0;
        local_1df8 = CONCAT44((int)local_1108,(int)local_10e8);
        uStack_1df0 = CONCAT44(local_1108._4_4_,local_10e8._4_4_);
        local_2c8 = local_1bc8;
        uStack_2c0 = uStack_1bc0;
        local_2d8 = local_1bd8;
        uStack_2d0 = uStack_1bd0;
        local_1e08 = CONCAT44((int)local_1148,(int)local_1128);
        uStack_1e00 = CONCAT44(local_1148._4_4_,local_1128._4_4_);
        local_1e8 = local_1ba8;
        uStack_1e0 = uStack_1ba0;
        local_1f8 = local_1bb8;
        uStack_1f0 = uStack_1bb0;
        local_1e18 = CONCAT44((int)uStack_1100,(int)uStack_10e0);
        uStack_1e10 = CONCAT44(uStack_1100._4_4_,uStack_10e0._4_4_);
        local_208 = local_1bc8;
        uStack_200 = uStack_1bc0;
        local_218 = local_1bd8;
        uStack_210 = uStack_1bd0;
        local_1e28 = CONCAT44((int)uStack_1140,(int)uStack_1120);
        uStack_1e20 = CONCAT44(uStack_1140._4_4_,uStack_1120._4_4_);
        iStack_5c = local_1108._4_4_;
        iStack_6c = local_1148._4_4_;
        _local_58 = CONCAT44((int)uStack_1040,(int)uStack_1020);
        _local_68 = CONCAT44((int)local_1108,(int)local_10e8);
        uStack_1bb0 = CONCAT44(local_1108._4_4_,iStack_60);
        iStack_7c = uStack_1100._4_4_;
        iStack_8c = uStack_1140._4_4_;
        _local_78 = CONCAT44((int)local_1148,(int)local_1128);
        _local_88 = CONCAT44((int)uStack_1100,(int)uStack_10e0);
        uStack_1bd0 = CONCAT44(uStack_1100._4_4_,iStack_80);
        local_11f8 = (int)local_2698;
        iStack_11f4 = (int)((ulong)local_2698 >> 0x20);
        local_1b68 = CONCAT44((int)local_1008 + iStack_11f4,(int)local_fe8 + local_11f8);
        uStack_1b60 = CONCAT44((int)local_1048 + local_1008._4_4_,(int)local_1028 + iStack_20);
        local_1218 = (int)local_26b8;
        iStack_1214 = (int)((ulong)local_26b8 >> 0x20);
        local_1b88 = CONCAT44((int)uStack_1000 + iStack_1214,(int)uStack_fe0 + local_1218);
        uStack_1b80 = CONCAT44((int)uStack_1040 + uStack_1000._4_4_,(int)uStack_1020 + iStack_40);
        local_1238 = (int)local_2718;
        iStack_1234 = (int)((ulong)local_2718 >> 0x20);
        local_1ba8 = CONCAT44((int)local_1108 + iStack_1234,(int)local_10e8 + local_1238);
        uStack_1ba0 = CONCAT44((int)local_1148 + local_1108._4_4_,(int)local_1128 + iStack_60);
        local_1258 = (int)local_2738;
        iStack_1254 = (int)((ulong)local_2738 >> 0x20);
        local_1bc8 = CONCAT44((int)uStack_1100 + iStack_1254,(int)uStack_10e0 + local_1258);
        uStack_1bc0 = CONCAT44((int)uStack_1140 + uStack_1100._4_4_,(int)uStack_1120 + iStack_80);
        local_1268 = local_1b68;
        uStack_1260 = uStack_1b60;
        local_1278 = local_1b88;
        uStack_1270 = uStack_1b80;
        local_1b68 = CONCAT44((int)local_1008 + iStack_11f4 + (int)uStack_1000 + iStack_1214,
                              (int)local_fe8 + local_11f8 + (int)uStack_fe0 + local_1218);
        uStack_1b60 = CONCAT44((int)local_1048 + local_1008._4_4_ +
                               (int)uStack_1040 + uStack_1000._4_4_,
                               (int)local_1028 + iStack_20 + (int)uStack_1020 + iStack_40);
        local_1288 = local_1ba8;
        uStack_1280 = uStack_1ba0;
        local_1298 = local_1bc8;
        uStack_1290 = uStack_1bc0;
        local_1ba8 = CONCAT44((int)local_1108 + iStack_1234 + (int)uStack_1100 + iStack_1254,
                              (int)local_10e8 + local_1238 + (int)uStack_10e0 + local_1258);
        uStack_1ba0 = CONCAT44((int)local_1148 + local_1108._4_4_ +
                               (int)uStack_1140 + uStack_1100._4_4_,
                               (int)local_1128 + iStack_60 + (int)uStack_1120 + iStack_80);
        local_c90 = local_1a58;
        local_ca8 = local_1b68;
        uStack_ca0 = uStack_1b60;
        *local_1a58 = local_1b68;
        local_1a58[1] = uStack_1b60;
        local_cb0 = local_1a58 + 2;
        local_cc8 = local_1ba8;
        uStack_cc0 = uStack_1ba0;
        *local_cb0 = local_1ba8;
        local_1a58[3] = uStack_1ba0;
        local_1a58 = local_1a58 + 4;
        local_1748 = local_17d0;
        local_1728 = local_17e0;
        uStack_1250 = uStack_1bd0;
        local_1248 = local_1e18;
        uStack_1240 = local_1e28;
        uStack_1230 = uStack_1bb0;
        local_1228 = local_1df8;
        uStack_1220 = local_1e08;
        uStack_1210 = uStack_1b90;
        local_1208 = local_1dd8;
        uStack_1200 = local_1de8;
        uStack_11f0 = uStack_1b70;
        local_11e8 = local_1db8;
        uStack_11e0 = local_1dc8;
        local_1148 = uVar1;
        uStack_1140 = uVar2;
        local_1128 = uVar3;
        uStack_1120 = uVar4;
        local_1108 = uVar5;
        uStack_1100 = uVar6;
        local_10e8 = uVar7;
        uStack_10e0 = uVar8;
        local_1048 = uVar9;
        uStack_1040 = uVar10;
        local_1028 = uVar11;
        uStack_1020 = uVar12;
        local_1008 = uVar13;
        uStack_1000 = uVar14;
        local_fe8 = uVar15;
        uStack_fe0 = uVar16;
        local_158 = local_1e28;
        uStack_150 = uStack_1e20;
        local_148 = local_1e18;
        uStack_140 = uStack_1e10;
        local_138 = local_1e08;
        uStack_130 = uStack_1e00;
        local_128 = local_1df8;
        uStack_120 = uStack_1df0;
        local_118 = local_1de8;
        uStack_110 = uStack_1de0;
        local_108 = local_1dd8;
        uStack_100 = uStack_1dd0;
        local_f8 = local_1dc8;
        uStack_f0 = uStack_1dc0;
        local_e8 = local_1db8;
        uStack_e0 = uStack_1db0;
        local_98 = local_1e28;
        local_1b28 = local_f60;
      }
      for (; local_1aa4 < local_185c; local_1aa4 = local_1aa4 + 1) {
        local_167c = local_1aa4 / 2 + local_1aa4 % 2;
        local_1670 = &local_1e78;
        local_1678 = &local_18b0;
        local_df8 = (long *)((long)local_18b0 + local_1870 * local_167c * local_18a0);
        local_de0 = &local_1e78;
        local_dd0 = (long)local_1884 * (long)local_1880 * local_18a0;
        local_c68 = &local_1e78;
        local_17c8 = &local_1e78;
        local_1580 = &local_1ec8;
        local_efc = *(int *)((long)local_1850 + 0x2c);
        local_f00 = (int)local_1850[6];
        local_f04 = *(undefined4 *)((long)local_1850 + 0x34);
        local_f10 = (long *)(*local_1850 + local_1850[8] * (long)local_1a50 * local_1850[2]);
        local_f18 = local_1850[2];
        local_f1c = (undefined4)local_1850[3];
        local_f28 = local_1850[4];
        local_ef8 = &local_1ec8;
        local_d80 = (long)local_efc * (long)local_f00 * local_f18;
        local_1e40 = 0;
        local_1e44 = 0;
        local_1e48 = 0;
        local_1e4c = 0;
        local_1e58 = local_1890;
        local_1e60 = 0;
        local_1e68 = 0;
        local_1e70 = 0;
        local_1e78 = 0;
        local_d84 = 0x10;
        local_dd4 = 0x10;
        local_de4 = local_1884;
        local_de8 = local_1880;
        local_dec = local_187c;
        local_e00 = local_18a0;
        local_e04 = local_1898;
        local_e10 = local_1890;
        local_158c = local_1a50;
        local_158d = 1;
        local_167d = 1;
        local_1e38 = 0;
        local_1e50 = 0;
        local_d48 = &local_1ec8;
        local_17b8 = &local_1ec8;
        local_1ec8 = 0;
        local_1eb8 = 0;
        local_1eb0 = 0;
        local_1ea0 = 0;
        local_1e9c = 0;
        local_1e98 = 0;
        local_1e94 = 0;
        local_1e90 = 0;
        local_1e88 = 0;
        local_1ec0 = 0;
        local_bf8 = 0;
        uStack_bf0 = 0;
        local_1ee8 = 0;
        uStack_1ee0 = 0;
        local_c08 = 0;
        uStack_c00 = 0;
        local_1ef8 = 0;
        uStack_1ef0 = 0;
        local_c18 = 0;
        uStack_c10 = 0;
        local_1f08 = 0;
        uStack_1f00 = 0;
        local_c28 = 0;
        uStack_c20 = 0;
        local_1f18 = 0;
        uStack_1f10 = 0;
        local_1f1c = 0;
        local_1e80 = local_f10;
        local_1e30 = local_df8;
        while( true ) {
          uVar8 = uStack_12a0;
          uVar7 = local_12a8;
          uVar6 = uStack_12c0;
          uVar5 = local_12c8;
          uVar4 = uStack_12e0;
          uVar3 = local_12e8;
          uVar2 = uStack_1300;
          uVar1 = local_1308;
          local_12a8._0_4_ = (int)local_1ee8;
          local_12a8._4_4_ = (int)((ulong)local_1ee8 >> 0x20);
          uStack_12a0._0_4_ = (int)uStack_1ee0;
          uStack_12a0._4_4_ = (int)((ulong)uStack_1ee0 >> 0x20);
          local_12c8._0_4_ = (int)local_1ef8;
          local_12c8._4_4_ = (int)((ulong)local_1ef8 >> 0x20);
          uStack_12c0._0_4_ = (int)uStack_1ef0;
          uStack_12c0._4_4_ = (int)((ulong)uStack_1ef0 >> 0x20);
          local_12e8._0_4_ = (int)local_1f08;
          local_12e8._4_4_ = (int)((ulong)local_1f08 >> 0x20);
          uStack_12e0._0_4_ = (int)uStack_1f00;
          uStack_12e0._4_4_ = (int)((ulong)uStack_1f00 >> 0x20);
          local_1308._0_4_ = (int)local_1f18;
          local_1308._4_4_ = (int)((ulong)local_1f18 >> 0x20);
          uStack_1300._0_4_ = (int)uStack_1f10;
          uStack_1300._4_4_ = (int)((ulong)uStack_1f10 >> 0x20);
          if (local_1864 * local_1860 <= local_1f1c) break;
          local_8 = local_1e30;
          local_a28 = *local_1e30;
          uStack_10 = 0;
          local_c38 = 0;
          uStack_c30 = 0;
          local_ae8 = 0;
          uStack_ae0 = 0;
          uStack_af0 = 0;
          local_af8._0_1_ = (char)local_a28;
          local_af8._1_1_ = (char)((ulong)local_a28 >> 8);
          local_af8._2_1_ = (char)((ulong)local_a28 >> 0x10);
          local_af8._3_1_ = (char)((ulong)local_a28 >> 0x18);
          local_af8._4_1_ = (char)((ulong)local_a28 >> 0x20);
          local_af8._5_1_ = (char)((ulong)local_a28 >> 0x28);
          local_af8._6_1_ = (char)((ulong)local_a28 >> 0x30);
          local_af8._7_1_ = (undefined1)((ulong)local_a28 >> 0x38);
          local_a38 = CONCAT17(-(local_a28 < 0),
                               CONCAT16(-(local_af8._6_1_ < '\0'),
                                        CONCAT15(-(local_af8._5_1_ < '\0'),
                                                 CONCAT14(-(local_af8._4_1_ < '\0'),
                                                          CONCAT13(-(local_af8._3_1_ < '\0'),
                                                                   CONCAT12(-(local_af8._2_1_ < '\0'
                                                                             ),CONCAT11(-(local_af8.
                                                                                          _1_1_ < 
                                                  '\0'),-((char)local_af8 < '\0'))))))));
          uStack_a30 = 0;
          uStack_a20 = 0;
          sVar95 = CONCAT11(-((char)local_af8 < '\0'),(char)local_af8);
          uVar43 = CONCAT13(-(local_af8._1_1_ < '\0'),CONCAT12(local_af8._1_1_,sVar95));
          uVar44 = CONCAT15(-(local_af8._2_1_ < '\0'),CONCAT14(local_af8._2_1_,uVar43));
          local_908 = CONCAT17(-(local_af8._3_1_ < '\0'),CONCAT16(local_af8._3_1_,uVar44));
          sVar109 = CONCAT11(-(local_af8._4_1_ < '\0'),local_af8._4_1_);
          uVar45 = CONCAT13(-(local_af8._5_1_ < '\0'),CONCAT12(local_af8._5_1_,sVar109));
          uVar46 = CONCAT15(-(local_af8._6_1_ < '\0'),CONCAT14(local_af8._6_1_,uVar45));
          uStack_900 = CONCAT17(-(local_a28 < 0),CONCAT16(local_af8._7_1_,uVar46));
          local_d10 = local_1e80;
          local_a48 = *local_1e80;
          lStack_a40 = local_1e80[1];
          local_d18 = local_1e80 + 2;
          local_a68 = *local_d18;
          lStack_a60 = local_1e80[3];
          local_c48 = 0;
          uStack_c40 = 0;
          local_b08 = 0;
          uStack_b00 = 0;
          local_b18._0_1_ = (char)local_a48;
          local_b18._1_1_ = (char)((ulong)local_a48 >> 8);
          local_b18._2_1_ = (char)((ulong)local_a48 >> 0x10);
          local_b18._3_1_ = (char)((ulong)local_a48 >> 0x18);
          local_b18._4_1_ = (char)((ulong)local_a48 >> 0x20);
          local_b18._5_1_ = (char)((ulong)local_a48 >> 0x28);
          local_b18._6_1_ = (char)((ulong)local_a48 >> 0x30);
          local_b18._7_1_ = (undefined1)((ulong)local_a48 >> 0x38);
          uStack_b10._0_1_ = (char)lStack_a40;
          uStack_b10._1_1_ = (char)((ulong)lStack_a40 >> 8);
          uStack_b10._2_1_ = (char)((ulong)lStack_a40 >> 0x10);
          uStack_b10._3_1_ = (char)((ulong)lStack_a40 >> 0x18);
          uStack_b10._4_1_ = (char)((ulong)lStack_a40 >> 0x20);
          uStack_b10._5_1_ = (char)((ulong)lStack_a40 >> 0x28);
          uStack_b10._6_1_ = (char)((ulong)lStack_a40 >> 0x30);
          uStack_b10._7_1_ = (undefined1)((ulong)lStack_a40 >> 0x38);
          local_a58 = CONCAT17(-(local_a48 < 0),
                               CONCAT16(-(local_b18._6_1_ < '\0'),
                                        CONCAT15(-(local_b18._5_1_ < '\0'),
                                                 CONCAT14(-(local_b18._4_1_ < '\0'),
                                                          CONCAT13(-(local_b18._3_1_ < '\0'),
                                                                   CONCAT12(-(local_b18._2_1_ < '\0'
                                                                             ),CONCAT11(-(local_b18.
                                                                                          _1_1_ < 
                                                  '\0'),-((char)local_b18 < '\0'))))))));
          uStack_a50 = CONCAT17(-(lStack_a40 < 0),
                                CONCAT16(-(uStack_b10._6_1_ < '\0'),
                                         CONCAT15(-(uStack_b10._5_1_ < '\0'),
                                                  CONCAT14(-(uStack_b10._4_1_ < '\0'),
                                                           CONCAT13(-(uStack_b10._3_1_ < '\0'),
                                                                    CONCAT12(-(uStack_b10._2_1_ <
                                                                              '\0'),CONCAT11(-(
                                                  uStack_b10._1_1_ < '\0'),
                                                  -((char)uStack_b10 < '\0'))))))));
          local_c58 = 0;
          uStack_c50 = 0;
          local_b28 = 0;
          uStack_b20 = 0;
          local_b38._0_1_ = (char)local_a68;
          local_b38._1_1_ = (char)((ulong)local_a68 >> 8);
          local_b38._2_1_ = (char)((ulong)local_a68 >> 0x10);
          local_b38._3_1_ = (char)((ulong)local_a68 >> 0x18);
          local_b38._4_1_ = (char)((ulong)local_a68 >> 0x20);
          local_b38._5_1_ = (char)((ulong)local_a68 >> 0x28);
          local_b38._6_1_ = (char)((ulong)local_a68 >> 0x30);
          local_b38._7_1_ = (undefined1)((ulong)local_a68 >> 0x38);
          uStack_b30._0_1_ = (char)lStack_a60;
          uStack_b30._1_1_ = (char)((ulong)lStack_a60 >> 8);
          uStack_b30._2_1_ = (char)((ulong)lStack_a60 >> 0x10);
          uStack_b30._3_1_ = (char)((ulong)lStack_a60 >> 0x18);
          uStack_b30._4_1_ = (char)((ulong)lStack_a60 >> 0x20);
          uStack_b30._5_1_ = (char)((ulong)lStack_a60 >> 0x28);
          uStack_b30._6_1_ = (char)((ulong)lStack_a60 >> 0x30);
          uStack_b30._7_1_ = (undefined1)((ulong)lStack_a60 >> 0x38);
          local_a78 = CONCAT17(-(local_a68 < 0),
                               CONCAT16(-(local_b38._6_1_ < '\0'),
                                        CONCAT15(-(local_b38._5_1_ < '\0'),
                                                 CONCAT14(-(local_b38._4_1_ < '\0'),
                                                          CONCAT13(-(local_b38._3_1_ < '\0'),
                                                                   CONCAT12(-(local_b38._2_1_ < '\0'
                                                                             ),CONCAT11(-(local_b38.
                                                                                          _1_1_ < 
                                                  '\0'),-((char)local_b38 < '\0'))))))));
          uStack_a70 = CONCAT17(-(lStack_a60 < 0),
                                CONCAT16(-(uStack_b30._6_1_ < '\0'),
                                         CONCAT15(-(uStack_b30._5_1_ < '\0'),
                                                  CONCAT14(-(uStack_b30._4_1_ < '\0'),
                                                           CONCAT13(-(uStack_b30._3_1_ < '\0'),
                                                                    CONCAT12(-(uStack_b30._2_1_ <
                                                                              '\0'),CONCAT11(-(
                                                  uStack_b30._1_1_ < '\0'),
                                                  -((char)uStack_b30 < '\0'))))))));
          sVar92 = CONCAT11(-((char)local_b18 < '\0'),(char)local_b18);
          uVar39 = CONCAT13(-(local_b18._1_1_ < '\0'),CONCAT12(local_b18._1_1_,sVar92));
          uVar40 = CONCAT15(-(local_b18._2_1_ < '\0'),CONCAT14(local_b18._2_1_,uVar39));
          local_738 = CONCAT17(-(local_b18._3_1_ < '\0'),CONCAT16(local_b18._3_1_,uVar40));
          sVar106 = CONCAT11(-(local_b18._4_1_ < '\0'),local_b18._4_1_);
          uVar41 = CONCAT13(-(local_b18._5_1_ < '\0'),CONCAT12(local_b18._5_1_,sVar106));
          uVar42 = CONCAT15(-(local_b18._6_1_ < '\0'),CONCAT14(local_b18._6_1_,uVar41));
          uStack_730 = CONCAT17(-(local_a48 < 0),CONCAT16(local_b18._7_1_,uVar42));
          sVar93 = CONCAT11(-((char)uStack_b10 < '\0'),(char)uStack_b10);
          uVar35 = CONCAT13(-(uStack_b10._1_1_ < '\0'),CONCAT12(uStack_b10._1_1_,sVar93));
          uVar36 = CONCAT15(-(uStack_b10._2_1_ < '\0'),CONCAT14(uStack_b10._2_1_,uVar35));
          local_758 = CONCAT17(-(uStack_b10._3_1_ < '\0'),CONCAT16(uStack_b10._3_1_,uVar36));
          sVar107 = CONCAT11(-(uStack_b10._4_1_ < '\0'),uStack_b10._4_1_);
          uVar37 = CONCAT13(-(uStack_b10._5_1_ < '\0'),CONCAT12(uStack_b10._5_1_,sVar107));
          uVar38 = CONCAT15(-(uStack_b10._6_1_ < '\0'),CONCAT14(uStack_b10._6_1_,uVar37));
          uStack_750 = CONCAT17(-(lStack_a40 < 0),CONCAT16(uStack_b10._7_1_,uVar38));
          sVar94 = CONCAT11(-((char)local_b38 < '\0'),(char)local_b38);
          uVar31 = CONCAT13(-(local_b38._1_1_ < '\0'),CONCAT12(local_b38._1_1_,sVar94));
          uVar32 = CONCAT15(-(local_b38._2_1_ < '\0'),CONCAT14(local_b38._2_1_,uVar31));
          local_778 = CONCAT17(-(local_b38._3_1_ < '\0'),CONCAT16(local_b38._3_1_,uVar32));
          sVar108 = CONCAT11(-(local_b38._4_1_ < '\0'),local_b38._4_1_);
          uVar33 = CONCAT13(-(local_b38._5_1_ < '\0'),CONCAT12(local_b38._5_1_,sVar108));
          uVar34 = CONCAT15(-(local_b38._6_1_ < '\0'),CONCAT14(local_b38._6_1_,uVar33));
          uStack_770 = CONCAT17(-(local_a68 < 0),CONCAT16(local_b38._7_1_,uVar34));
          sVar25 = CONCAT11(-((char)uStack_b30 < '\0'),(char)uStack_b30);
          uVar26 = CONCAT13(-(uStack_b30._1_1_ < '\0'),CONCAT12(uStack_b30._1_1_,sVar25));
          uVar27 = CONCAT15(-(uStack_b30._2_1_ < '\0'),CONCAT14(uStack_b30._2_1_,uVar26));
          local_798 = CONCAT17(-(uStack_b30._3_1_ < '\0'),CONCAT16(uStack_b30._3_1_,uVar27));
          sVar28 = CONCAT11(-(uStack_b30._4_1_ < '\0'),uStack_b30._4_1_);
          uVar29 = CONCAT13(-(uStack_b30._5_1_ < '\0'),CONCAT12(uStack_b30._5_1_,sVar28));
          uVar30 = CONCAT15(-(uStack_b30._6_1_ < '\0'),CONCAT14(uStack_b30._6_1_,uVar29));
          uStack_790 = CONCAT17(-(lStack_a60 < 0),CONCAT16(uStack_b30._7_1_,uVar30));
          local_8a8._2_2_ = (short)((uint)uVar43 >> 0x10);
          local_8a8._4_2_ = (short)((uint6)uVar44 >> 0x20);
          local_8a8._6_2_ = (short)((ulong)local_908 >> 0x30);
          uStack_8a0._2_2_ = (short)((uint)uVar45 >> 0x10);
          uStack_8a0._4_2_ = (short)((uint6)uVar46 >> 0x20);
          uStack_8a0._6_2_ = (short)((ulong)uStack_900 >> 0x30);
          local_8b8._2_2_ = (short)((uint)uVar39 >> 0x10);
          local_8b8._4_2_ = (short)((uint6)uVar40 >> 0x20);
          local_8b8._6_2_ = (short)((ulong)local_738 >> 0x30);
          uStack_8b0._2_2_ = (short)((uint)uVar41 >> 0x10);
          uStack_8b0._4_2_ = (short)((uint6)uVar42 >> 0x20);
          uStack_8b0._6_2_ = (short)((ulong)uStack_730 >> 0x30);
          sVar92 = sVar95 * sVar92;
          sVar106 = sVar109 * sVar106;
          local_5a8 = CONCAT26(local_8a8._6_2_ * local_8b8._6_2_,
                               CONCAT24(local_8a8._4_2_ * local_8b8._4_2_,
                                        CONCAT22(local_8a8._2_2_ * local_8b8._2_2_,sVar92)));
          uStack_5a0 = CONCAT26(uStack_8a0._6_2_ * uStack_8b0._6_2_,
                                CONCAT24(uStack_8a0._4_2_ * uStack_8b0._4_2_,
                                         CONCAT22(uStack_8a0._2_2_ * uStack_8b0._2_2_,sVar106)));
          auVar84._8_8_ = uStack_900;
          auVar84._0_8_ = local_908;
          auVar83._8_8_ = uStack_730;
          auVar83._0_8_ = local_738;
          auVar103 = pmulhw(auVar84,auVar83);
          local_28e8 = auVar103._0_8_;
          uStack_28e0 = auVar103._8_8_;
          local_8d8._2_2_ = (short)((uint)uVar35 >> 0x10);
          local_8d8._4_2_ = (short)((uint6)uVar36 >> 0x20);
          local_8d8._6_2_ = (short)((ulong)local_758 >> 0x30);
          uStack_8d0._2_2_ = (short)((uint)uVar37 >> 0x10);
          uStack_8d0._4_2_ = (short)((uint6)uVar38 >> 0x20);
          uStack_8d0._6_2_ = (short)((ulong)uStack_750 >> 0x30);
          sVar93 = sVar95 * sVar93;
          sVar107 = sVar109 * sVar107;
          local_5c8 = CONCAT26(local_8a8._6_2_ * local_8d8._6_2_,
                               CONCAT24(local_8a8._4_2_ * local_8d8._4_2_,
                                        CONCAT22(local_8a8._2_2_ * local_8d8._2_2_,sVar93)));
          uStack_5c0 = CONCAT26(uStack_8a0._6_2_ * uStack_8d0._6_2_,
                                CONCAT24(uStack_8a0._4_2_ * uStack_8d0._4_2_,
                                         CONCAT22(uStack_8a0._2_2_ * uStack_8d0._2_2_,sVar107)));
          auVar82._8_8_ = uStack_900;
          auVar82._0_8_ = local_908;
          auVar81._8_8_ = uStack_750;
          auVar81._0_8_ = local_758;
          auVar104 = pmulhw(auVar82,auVar81);
          local_2908 = auVar104._0_8_;
          uStack_2900 = auVar104._8_8_;
          local_8f8._2_2_ = (short)((uint)uVar31 >> 0x10);
          local_8f8._4_2_ = (short)((uint6)uVar32 >> 0x20);
          local_8f8._6_2_ = (short)((ulong)local_778 >> 0x30);
          uStack_8f0._2_2_ = (short)((uint)uVar33 >> 0x10);
          uStack_8f0._4_2_ = (short)((uint6)uVar34 >> 0x20);
          uStack_8f0._6_2_ = (short)((ulong)uStack_770 >> 0x30);
          sVar94 = sVar95 * sVar94;
          sVar108 = sVar109 * sVar108;
          local_5e8 = CONCAT26(local_8a8._6_2_ * local_8f8._6_2_,
                               CONCAT24(local_8a8._4_2_ * local_8f8._4_2_,
                                        CONCAT22(local_8a8._2_2_ * local_8f8._2_2_,sVar94)));
          uStack_5e0 = CONCAT26(uStack_8a0._6_2_ * uStack_8f0._6_2_,
                                CONCAT24(uStack_8a0._4_2_ * uStack_8f0._4_2_,
                                         CONCAT22(uStack_8a0._2_2_ * uStack_8f0._2_2_,sVar108)));
          auVar80._8_8_ = uStack_900;
          auVar80._0_8_ = local_908;
          auVar79._8_8_ = uStack_770;
          auVar79._0_8_ = local_778;
          auVar102 = pmulhw(auVar80,auVar79);
          local_2928 = auVar102._0_8_;
          uStack_2920 = auVar102._8_8_;
          local_918._2_2_ = (short)((uint)uVar26 >> 0x10);
          local_918._4_2_ = (short)((uint6)uVar27 >> 0x20);
          local_918._6_2_ = (short)((ulong)local_798 >> 0x30);
          uStack_910._2_2_ = (short)((uint)uVar29 >> 0x10);
          uStack_910._4_2_ = (short)((uint6)uVar30 >> 0x20);
          uStack_910._6_2_ = (short)((ulong)uStack_790 >> 0x30);
          sVar95 = sVar95 * sVar25;
          sVar109 = sVar109 * sVar28;
          local_608 = CONCAT26(local_8a8._6_2_ * local_918._6_2_,
                               CONCAT24(local_8a8._4_2_ * local_918._4_2_,
                                        CONCAT22(local_8a8._2_2_ * local_918._2_2_,sVar95)));
          uStack_600 = CONCAT26(uStack_8a0._6_2_ * uStack_910._6_2_,
                                CONCAT24(uStack_8a0._4_2_ * uStack_910._4_2_,
                                         CONCAT22(uStack_8a0._2_2_ * uStack_910._2_2_,sVar109)));
          auVar78._8_8_ = uStack_900;
          auVar78._0_8_ = local_908;
          auVar77._8_8_ = uStack_790;
          auVar77._0_8_ = local_798;
          auVar105 = pmulhw(auVar78,auVar77);
          local_2948 = auVar105._0_8_;
          local_2038 = local_2948;
          uStack_2940 = auVar105._8_8_;
          uStack_5b0 = uStack_28e0;
          local_5b8._0_2_ = auVar103._0_2_;
          local_5b8._2_2_ = auVar103._2_2_;
          local_5b8._4_2_ = auVar103._4_2_;
          local_5b8._6_2_ = auVar103._6_2_;
          iVar91 = CONCAT22((undefined2)local_5b8,sVar92);
          uVar23 = CONCAT26(local_5b8._2_2_,CONCAT24(local_8a8._2_2_ * local_8b8._2_2_,iVar91));
          iVar111 = CONCAT22(local_5b8._4_2_,local_8a8._4_2_ * local_8b8._4_2_);
          uVar24 = CONCAT26(local_5b8._6_2_,CONCAT24(local_8a8._6_2_ * local_8b8._6_2_,iVar111));
          uVar1 = local_1ee8;
          uVar2 = uStack_1ee0;
          local_12b8._4_4_ = (int)((ulong)uVar23 >> 0x20);
          uStack_12b0._4_4_ = (int)((ulong)uVar24 >> 0x20);
          local_12a8._0_4_ = (int)local_12a8 + iVar91;
          uStack_12a0._0_4_ = (int)uStack_12a0 + iVar111;
          local_1ee8 = CONCAT44(local_12a8._4_4_ + local_12b8._4_4_,(int)local_12a8);
          uStack_1ee0 = CONCAT44(uStack_12a0._4_4_ + uStack_12b0._4_4_,(int)uStack_12a0);
          uStack_5d0 = uStack_2900;
          local_5d8._0_2_ = auVar104._0_2_;
          local_5d8._2_2_ = auVar104._2_2_;
          local_5d8._4_2_ = auVar104._4_2_;
          local_5d8._6_2_ = auVar104._6_2_;
          iVar91 = CONCAT22((undefined2)local_5d8,sVar93);
          uVar21 = CONCAT26(local_5d8._2_2_,CONCAT24(local_8a8._2_2_ * local_8d8._2_2_,iVar91));
          iVar111 = CONCAT22(local_5d8._4_2_,local_8a8._4_2_ * local_8d8._4_2_);
          uVar22 = CONCAT26(local_5d8._6_2_,CONCAT24(local_8a8._6_2_ * local_8d8._6_2_,iVar111));
          uVar3 = local_1ef8;
          uVar4 = uStack_1ef0;
          local_12d8._4_4_ = (int)((ulong)uVar21 >> 0x20);
          uStack_12d0._4_4_ = (int)((ulong)uVar22 >> 0x20);
          local_12c8._0_4_ = (int)local_12c8 + iVar91;
          uStack_12c0._0_4_ = (int)uStack_12c0 + iVar111;
          local_1ef8 = CONCAT44(local_12c8._4_4_ + local_12d8._4_4_,(int)local_12c8);
          uStack_1ef0 = CONCAT44(uStack_12c0._4_4_ + uStack_12d0._4_4_,(int)uStack_12c0);
          uStack_5f0 = uStack_2920;
          local_5f8._0_2_ = auVar102._0_2_;
          local_5f8._2_2_ = auVar102._2_2_;
          local_5f8._4_2_ = auVar102._4_2_;
          local_5f8._6_2_ = auVar102._6_2_;
          iVar91 = CONCAT22((undefined2)local_5f8,sVar94);
          uVar19 = CONCAT26(local_5f8._2_2_,CONCAT24(local_8a8._2_2_ * local_8f8._2_2_,iVar91));
          iVar111 = CONCAT22(local_5f8._4_2_,local_8a8._4_2_ * local_8f8._4_2_);
          uVar20 = CONCAT26(local_5f8._6_2_,CONCAT24(local_8a8._6_2_ * local_8f8._6_2_,iVar111));
          uVar5 = local_1f08;
          uVar6 = uStack_1f00;
          local_12f8._4_4_ = (int)((ulong)uVar19 >> 0x20);
          uStack_12f0._4_4_ = (int)((ulong)uVar20 >> 0x20);
          local_12e8._0_4_ = (int)local_12e8 + iVar91;
          uStack_12e0._0_4_ = (int)uStack_12e0 + iVar111;
          local_1f08 = CONCAT44(local_12e8._4_4_ + local_12f8._4_4_,(int)local_12e8);
          uStack_1f00 = CONCAT44(uStack_12e0._4_4_ + uStack_12f0._4_4_,(int)uStack_12e0);
          uStack_610 = uStack_2940;
          local_618._0_2_ = auVar105._0_2_;
          local_618._2_2_ = auVar105._2_2_;
          local_618._4_2_ = auVar105._4_2_;
          local_618._6_2_ = auVar105._6_2_;
          iVar91 = CONCAT22((undefined2)local_618,sVar95);
          uVar17 = CONCAT26(local_618._2_2_,CONCAT24(local_8a8._2_2_ * local_918._2_2_,iVar91));
          iVar111 = CONCAT22(local_618._4_2_,local_8a8._4_2_ * local_918._4_2_);
          uVar18 = CONCAT26(local_618._6_2_,CONCAT24(local_8a8._6_2_ * local_918._6_2_,iVar111));
          uVar7 = local_1f18;
          uVar8 = uStack_1f10;
          local_1318._4_4_ = (int)((ulong)uVar17 >> 0x20);
          uStack_1310._4_4_ = (int)((ulong)uVar18 >> 0x20);
          local_1308._0_4_ = (int)local_1308 + iVar91;
          uStack_1300._0_4_ = (int)uStack_1300 + iVar111;
          local_1f18 = CONCAT44(local_1308._4_4_ + local_1318._4_4_,(int)local_1308);
          uStack_1f10 = CONCAT44(uStack_1300._4_4_ + uStack_1310._4_4_,(int)uStack_1300);
          local_438 = local_28e8;
          uStack_430._0_2_ = auVar103._8_2_;
          uStack_430._2_2_ = auVar103._10_2_;
          uStack_430._4_2_ = auVar103._12_2_;
          uStack_430._6_2_ = auVar103._14_2_;
          iVar91 = CONCAT22((undefined2)uStack_430,sVar106);
          uVar15 = CONCAT26(uStack_430._2_2_,CONCAT24(uStack_8a0._2_2_ * uStack_8b0._2_2_,iVar91));
          iVar111 = CONCAT22(uStack_430._4_2_,uStack_8a0._4_2_ * uStack_8b0._4_2_);
          uVar16 = CONCAT26(uStack_430._6_2_,CONCAT24(uStack_8a0._6_2_ * uStack_8b0._6_2_,iVar111));
          local_1328 = local_1ee8;
          uStack_1320 = uStack_1ee0;
          local_1338._4_4_ = (int)((ulong)uVar15 >> 0x20);
          uStack_1330._4_4_ = (int)((ulong)uVar16 >> 0x20);
          local_1ee8 = CONCAT44(local_12a8._4_4_ + local_12b8._4_4_ + local_1338._4_4_,
                                (int)local_12a8 + iVar91);
          uStack_1ee0 = CONCAT44(uStack_12a0._4_4_ + uStack_12b0._4_4_ + uStack_1330._4_4_,
                                 (int)uStack_12a0 + iVar111);
          local_458 = local_2908;
          uStack_450._0_2_ = auVar104._8_2_;
          uStack_450._2_2_ = auVar104._10_2_;
          uStack_450._4_2_ = auVar104._12_2_;
          uStack_450._6_2_ = auVar104._14_2_;
          iVar91 = CONCAT22((undefined2)uStack_450,sVar107);
          uVar13 = CONCAT26(uStack_450._2_2_,CONCAT24(uStack_8a0._2_2_ * uStack_8d0._2_2_,iVar91));
          iVar111 = CONCAT22(uStack_450._4_2_,uStack_8a0._4_2_ * uStack_8d0._4_2_);
          uVar14 = CONCAT26(uStack_450._6_2_,CONCAT24(uStack_8a0._6_2_ * uStack_8d0._6_2_,iVar111));
          local_1348 = local_1ef8;
          uStack_1340 = uStack_1ef0;
          local_1358._4_4_ = (int)((ulong)uVar13 >> 0x20);
          uStack_1350._4_4_ = (int)((ulong)uVar14 >> 0x20);
          local_1ef8 = CONCAT44(local_12c8._4_4_ + local_12d8._4_4_ + local_1358._4_4_,
                                (int)local_12c8 + iVar91);
          uStack_1ef0 = CONCAT44(uStack_12c0._4_4_ + uStack_12d0._4_4_ + uStack_1350._4_4_,
                                 (int)uStack_12c0 + iVar111);
          local_478 = local_2928;
          uStack_470._0_2_ = auVar102._8_2_;
          uStack_470._2_2_ = auVar102._10_2_;
          uStack_470._4_2_ = auVar102._12_2_;
          uStack_470._6_2_ = auVar102._14_2_;
          iVar91 = CONCAT22((undefined2)uStack_470,sVar108);
          uVar11 = CONCAT26(uStack_470._2_2_,CONCAT24(uStack_8a0._2_2_ * uStack_8f0._2_2_,iVar91));
          iVar111 = CONCAT22(uStack_470._4_2_,uStack_8a0._4_2_ * uStack_8f0._4_2_);
          uVar12 = CONCAT26(uStack_470._6_2_,CONCAT24(uStack_8a0._6_2_ * uStack_8f0._6_2_,iVar111));
          local_1368 = local_1f08;
          uStack_1360 = uStack_1f00;
          local_1378._4_4_ = (int)((ulong)uVar11 >> 0x20);
          uStack_1370._4_4_ = (int)((ulong)uVar12 >> 0x20);
          local_1f08 = CONCAT44(local_12e8._4_4_ + local_12f8._4_4_ + local_1378._4_4_,
                                (int)local_12e8 + iVar91);
          uStack_1f00 = CONCAT44(uStack_12e0._4_4_ + uStack_12f0._4_4_ + uStack_1370._4_4_,
                                 (int)uStack_12e0 + iVar111);
          local_498 = local_2948;
          uStack_490._0_2_ = auVar105._8_2_;
          uStack_490._2_2_ = auVar105._10_2_;
          uStack_490._4_2_ = auVar105._12_2_;
          uStack_490._6_2_ = auVar105._14_2_;
          iVar91 = CONCAT22((undefined2)uStack_490,sVar109);
          uVar9 = CONCAT26(uStack_490._2_2_,CONCAT24(uStack_8a0._2_2_ * uStack_910._2_2_,iVar91));
          iVar111 = CONCAT22(uStack_490._4_2_,uStack_8a0._4_2_ * uStack_910._4_2_);
          uVar10 = CONCAT26(uStack_490._6_2_,CONCAT24(uStack_8a0._6_2_ * uStack_910._6_2_,iVar111));
          local_1388 = local_1f18;
          uStack_1380 = uStack_1f10;
          local_1398._4_4_ = (int)((ulong)uVar9 >> 0x20);
          uStack_1390._4_4_ = (int)((ulong)uVar10 >> 0x20);
          local_1f18 = CONCAT44(local_1308._4_4_ + local_1318._4_4_ + local_1398._4_4_,
                                (int)local_1308 + iVar91);
          uStack_1f10 = CONCAT44(uStack_1300._4_4_ + uStack_1310._4_4_ + uStack_1390._4_4_,
                                 (int)uStack_1300 + iVar111);
          local_1e30 = local_1e30 + 1;
          local_1e80 = local_1e80 + 4;
          local_1f1c = local_1f1c + 1;
          local_1398 = uVar9;
          uStack_1390 = uVar10;
          local_1378 = uVar11;
          uStack_1370 = uVar12;
          local_1358 = uVar13;
          uStack_1350 = uVar14;
          local_1338 = uVar15;
          uStack_1330 = uVar16;
          local_1318 = uVar17;
          uStack_1310 = uVar18;
          local_1308 = uVar7;
          uStack_1300 = uVar8;
          local_12f8 = uVar19;
          uStack_12f0 = uVar20;
          local_12e8 = uVar5;
          uStack_12e0 = uVar6;
          local_12d8 = uVar21;
          uStack_12d0 = uVar22;
          local_12c8 = uVar3;
          uStack_12c0 = uVar4;
          local_12b8 = uVar23;
          uStack_12b0 = uVar24;
          local_12a8 = uVar1;
          uStack_12a0 = uVar2;
          local_b38 = local_a68;
          uStack_b30 = lStack_a60;
          local_b18 = local_a48;
          uStack_b10 = lStack_a40;
          local_af8 = local_a28;
          local_9b8 = local_a78;
          uStack_9b0 = uStack_a70;
          local_9a8 = local_a68;
          lStack_9a0 = lStack_a60;
          local_998 = local_a58;
          uStack_990 = uStack_a50;
          local_988 = local_a48;
          lStack_980 = lStack_a40;
          local_918 = local_798;
          uStack_910 = uStack_790;
          local_8f8 = local_778;
          uStack_8f0 = uStack_770;
          local_8e8 = local_908;
          uStack_8e0 = uStack_900;
          local_8d8 = local_758;
          uStack_8d0 = uStack_750;
          local_8c8 = local_908;
          uStack_8c0 = uStack_900;
          local_8b8 = local_738;
          uStack_8b0 = uStack_730;
          local_8a8 = local_908;
          uStack_8a0 = uStack_900;
          local_788 = local_908;
          uStack_780 = uStack_900;
          local_768 = local_908;
          uStack_760 = uStack_900;
          local_748 = local_908;
          uStack_740 = uStack_900;
          local_728 = local_908;
          uStack_720 = uStack_900;
          local_618 = local_2948;
          local_5f8 = local_2928;
          local_5d8 = local_2908;
          local_5b8 = local_28e8;
          uStack_490 = uStack_2940;
          local_488 = local_608;
          uStack_480 = uStack_600;
          uStack_470 = uStack_2920;
          local_468 = local_5e8;
          uStack_460 = uStack_5e0;
          uStack_450 = uStack_2900;
          local_448 = local_5c8;
          uStack_440 = uStack_5c0;
          uStack_430 = uStack_28e0;
          local_428 = local_5a8;
          uStack_420 = uStack_5a0;
          local_18 = local_a28;
        }
        local_2e8 = local_1ee8;
        uStack_2e0 = uStack_1ee0;
        local_2f8 = local_1ef8;
        uStack_2f0 = uStack_1ef0;
        local_13a8 = CONCAT44((int)local_12c8,(int)local_12a8);
        uStack_160 = CONCAT44(local_12c8._4_4_,local_12a8._4_4_);
        local_308 = local_1f08;
        uStack_300 = uStack_1f00;
        local_318 = local_1f18;
        uStack_310 = uStack_1f10;
        uStack_13a0 = CONCAT44((int)local_1308,(int)local_12e8);
        uStack_170 = CONCAT44(local_1308._4_4_,local_12e8._4_4_);
        local_228 = local_1ee8;
        uStack_220 = uStack_1ee0;
        local_238 = local_1ef8;
        uStack_230 = uStack_1ef0;
        local_13c8 = CONCAT44((int)uStack_12c0,(int)uStack_12a0);
        uStack_180 = CONCAT44(uStack_12c0._4_4_,uStack_12a0._4_4_);
        local_248 = local_1f08;
        uStack_240 = uStack_1f00;
        local_258 = local_1f18;
        uStack_250 = uStack_1f10;
        uStack_13c0 = CONCAT44((int)uStack_1300,(int)uStack_12e0);
        uStack_190 = CONCAT44(uStack_1300._4_4_,uStack_12e0._4_4_);
        iStack_9c = local_12c8._4_4_;
        iStack_ac = local_1308._4_4_;
        local_98 = CONCAT44(local_98._4_4_,(undefined4)local_2038);
        _local_a8 = CONCAT44((int)local_12c8,(int)local_12a8);
        uStack_13b0 = CONCAT44(local_12c8._4_4_,iStack_a0);
        iStack_bc = uStack_12c0._4_4_;
        iStack_cc = uStack_1300._4_4_;
        _local_b8 = CONCAT44((int)local_1308,(int)local_12e8);
        _local_c8 = CONCAT44((int)uStack_12c0,(int)uStack_12a0);
        uStack_13d0 = CONCAT44(uStack_12c0._4_4_,iStack_c0);
        local_13b8 = (int)local_2aa8;
        iStack_13b4 = (int)((ulong)local_2aa8 >> 0x20);
        local_1ee8 = CONCAT44((int)local_12c8 + iStack_13b4,(int)local_12a8 + local_13b8);
        uStack_1ee0 = CONCAT44((int)local_1308 + local_12c8._4_4_,(int)local_12e8 + iStack_a0);
        local_13d8 = (int)in_stack_ffffffffffffd538;
        iStack_13d4 = (int)(in_stack_ffffffffffffd538 >> 0x20);
        local_1f08 = CONCAT44((int)uStack_12c0 + iStack_13d4,(int)uStack_12a0 + local_13d8);
        uStack_1f00 = CONCAT44((int)uStack_1300 + uStack_12c0._4_4_,(int)uStack_12e0 + iStack_c0);
        local_13e8 = local_1ee8;
        uStack_13e0 = uStack_1ee0;
        local_13f8 = local_1f08;
        uStack_13f0 = uStack_1f00;
        local_1ee8 = CONCAT44((int)local_12c8 + iStack_13b4 + (int)uStack_12c0 + iStack_13d4,
                              (int)local_12a8 + local_13b8 + (int)uStack_12a0 + local_13d8);
        uStack_1ee0 = CONCAT44((int)local_1308 + local_12c8._4_4_ +
                               (int)uStack_1300 + uStack_12c0._4_4_,
                               (int)local_12e8 + iStack_a0 + (int)uStack_12e0 + iStack_c0);
        local_cd0 = local_1a58;
        local_ce8 = local_1ee8;
        uStack_ce0 = uStack_1ee0;
        *local_1a58 = local_1ee8;
        local_1a58[1] = uStack_1ee0;
        local_1a58 = local_1a58 + 2;
        local_1778 = local_17b8;
        local_1758 = local_17c8;
        local_1308 = uVar1;
        uStack_1300 = uVar2;
        local_12e8 = uVar3;
        uStack_12e0 = uVar4;
        local_12c8 = uVar5;
        uStack_12c0 = uVar6;
        local_12a8 = uVar7;
        uStack_12a0 = uVar8;
        local_198 = uStack_13c0;
        local_188 = local_13c8;
        local_178 = uStack_13a0;
        local_168 = local_13a8;
        local_d8 = uStack_13c0;
        local_1ea8 = local_f28;
      }
      local_1708 = local_17f0;
      local_1a80 = local_e80;
    }
    ppvVar110 = &local_18b0;
    if (local_18a8 != (int *)0x0) {
      local_178c = 0xffffffff;
      LOCK();
      local_1790 = *local_18a8;
      *local_18a8 = *local_18a8 + -1;
      UNLOCK();
      if (local_1790 == 1) {
        local_17b0 = ppvVar110;
        local_1788 = ppvVar110;
        if (local_1890 == (long *)0x0) {
          local_1408 = local_18b0;
          if (local_18b0 != (void *)0x0) {
            free(local_18b0);
          }
        }
        else {
          (**(code **)(*local_1890 + 0x18))(local_1890,local_18b0);
        }
      }
    }
    *ppvVar110 = (void *)0x0;
    ppvVar110[2] = (void *)0x0;
    *(undefined4 *)(ppvVar110 + 3) = 0;
    *(undefined4 *)(ppvVar110 + 5) = 0;
    *(undefined4 *)((long)ppvVar110 + 0x2c) = 0;
    *(undefined4 *)(ppvVar110 + 6) = 0;
    *(undefined4 *)((long)ppvVar110 + 0x34) = 0;
    *(undefined4 *)(ppvVar110 + 7) = 0;
    ppvVar110[8] = (void *)0x0;
    ppvVar110[1] = (void *)0x0;
  }
  else {
    im2col_sgemm_pack8to4_int8_sse_xop
              (in_stack_ffffffffffffd530,in_stack_ffffffffffffd528,in_stack_ffffffffffffd520,
               in_stack_ffffffffffffd518);
  }
  return;
}

Assistant:

static void im2col_sgemm_pack8to4_int8_sse(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Option& opt)
{
#if !(__AVX512VNNI__ || __AVXVNNI__ || __AVX2__ || __XOP__)
#if NCNN_RUNTIME_CPU && NCNN_AVX512VNNI && __AVX512F__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx512_vnni())
    {
        im2col_sgemm_pack8to4_int8_sse_avx512vnni(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVXVNNI && __AVX2__ && !__AVXVNNI__
    if (ncnn::cpu_support_x86_avx_vnni())
    {
        im2col_sgemm_pack8to4_int8_sse_avxvnni(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVX2 && __AVX__ && !__AVX2__
    if (ncnn::cpu_support_x86_avx2())
    {
        im2col_sgemm_pack8to4_int8_sse_avx2(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_XOP && __SSE2__ && !__XOP__
    if (ncnn::cpu_support_x86_xop())
    {
        im2col_sgemm_pack8to4_int8_sse_xop(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif
#endif

    // Mat bottom_im2col(size, maxk, inch, 8u, 8, opt.workspace_allocator);

    const int size = bottom_im2col.w;
    const int maxk = bottom_im2col.h;
    const int inch = bottom_im2col.c;

    const int outch = top_blob.c;

    // permute
    Mat tmp;
#if __AVX2__
    if (size >= 4)
        tmp.create(4 * maxk, inch, size / 4 + (size % 4) / 2 + size % 2, 8u, 8, opt.workspace_allocator);
    else if (size >= 2)
        tmp.create(2 * maxk, inch, size / 2 + size % 2, 8u, 8, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 8u, 8, opt.workspace_allocator);
#else
    if (size >= 2)
        tmp.create(2 * maxk, inch, size / 2 + size % 2, 8u, 8, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 8u, 8, opt.workspace_allocator);
#endif
    {
#if __AVX2__
        int remain_size_start = 0;
        int nn_size = size >> 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 4;

            int64_t* tmpptr = tmp.channel(i / 4);

            for (int q = 0; q < inch; q++)
            {
                const int64_t* img0 = (const int64_t*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    __m256i _v = _mm256_loadu_si256((const __m256i*)img0);
                    _mm256_storeu_si256((__m256i*)tmpptr, _v);
                    tmpptr += 4;
                    img0 += size;
                }
            }
        }

        remain_size_start += nn_size << 2;
        nn_size = (size - remain_size_start) >> 1;
#else
        int remain_size_start = 0;
        int nn_size = size >> 1;
#endif

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 2;

#if __AVX2__
            int64_t* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
#else
            int64_t* tmpptr = tmp.channel(i / 2);
#endif

            for (int q = 0; q < inch; q++)
            {
                const int64_t* img0 = (const int64_t*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    __m128i _v = _mm_loadu_si128((const __m128i*)img0);
                    _mm_storeu_si128((__m128i*)tmpptr, _v);
                    tmpptr += 2;
                    img0 += size;
                }
            }
        }

        remain_size_start += nn_size << 1;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
#if __AVX2__
            int64_t* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
#else
            int64_t* tmpptr = tmp.channel(i / 2 + i % 2);
#endif

            for (int q = 0; q < inch; q++)
            {
                const int64_t* img0 = (const int64_t*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr += 1;
                    img0 += size;
                }
            }
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        int* outptr0 = top_blob.channel(p);

        int i = 0;
#if __AVX2__
        for (; i + 3 < size; i += 4)
        {
            const signed char* tmpptr = tmp.channel(i / 4);
            const signed char* kptr0 = kernel.channel(p);

            int nn = inch * maxk; // inch always > 0

            __m256i _sum00_11 = _mm256_setzero_si256();
            __m256i _sum10_01 = _mm256_setzero_si256();
            __m256i _sum02_13 = _mm256_setzero_si256();
            __m256i _sum12_03 = _mm256_setzero_si256();

            __m256i _sum04_15 = _mm256_setzero_si256();
            __m256i _sum14_05 = _mm256_setzero_si256();
            __m256i _sum06_17 = _mm256_setzero_si256();
            __m256i _sum16_07 = _mm256_setzero_si256();

            int j = 0;
            for (; j < nn; j++)
            {
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m256i _val01_16 = _mm256_cvtepi8_epi16(_val01);

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);
                __m256i _w23_16 = _mm256_cvtepi8_epi16(_w23);

                __m256i _val10_16 = _mm256_permute4x64_epi64(_val01_16, 78);

#if __AVXVNNI__ || __AVX512VNNI__
                _sum00_11 = _mm256_dpwssd_epi32(_sum00_11, _val01_16, _w01_16);
                _sum10_01 = _mm256_dpwssd_epi32(_sum10_01, _val10_16, _w01_16);
                _sum02_13 = _mm256_dpwssd_epi32(_sum02_13, _val01_16, _w23_16);
                _sum12_03 = _mm256_dpwssd_epi32(_sum12_03, _val10_16, _w23_16);
#else
                __m256i _sl00_11 = _mm256_mullo_epi16(_val01_16, _w01_16);
                __m256i _sh00_11 = _mm256_mulhi_epi16(_val01_16, _w01_16);
                __m256i _sl10_01 = _mm256_mullo_epi16(_val10_16, _w01_16);
                __m256i _sh10_01 = _mm256_mulhi_epi16(_val10_16, _w01_16);
                __m256i _sl02_13 = _mm256_mullo_epi16(_val01_16, _w23_16);
                __m256i _sh02_13 = _mm256_mulhi_epi16(_val01_16, _w23_16);
                __m256i _sl12_03 = _mm256_mullo_epi16(_val10_16, _w23_16);
                __m256i _sh12_03 = _mm256_mulhi_epi16(_val10_16, _w23_16);

                _sum00_11 = _mm256_add_epi32(_sum00_11, _mm256_unpacklo_epi16(_sl00_11, _sh00_11));
                _sum10_01 = _mm256_add_epi32(_sum10_01, _mm256_unpacklo_epi16(_sl10_01, _sh10_01));
                _sum02_13 = _mm256_add_epi32(_sum02_13, _mm256_unpacklo_epi16(_sl02_13, _sh02_13));
                _sum12_03 = _mm256_add_epi32(_sum12_03, _mm256_unpacklo_epi16(_sl12_03, _sh12_03));
                _sum00_11 = _mm256_add_epi32(_sum00_11, _mm256_unpackhi_epi16(_sl00_11, _sh00_11));
                _sum10_01 = _mm256_add_epi32(_sum10_01, _mm256_unpackhi_epi16(_sl10_01, _sh10_01));
                _sum02_13 = _mm256_add_epi32(_sum02_13, _mm256_unpackhi_epi16(_sl02_13, _sh02_13));
                _sum12_03 = _mm256_add_epi32(_sum12_03, _mm256_unpackhi_epi16(_sl12_03, _sh12_03));
#endif

                __m128i _val23 = _mm_loadu_si128((const __m128i*)(tmpptr + 16));
                __m256i _val23_16 = _mm256_cvtepi8_epi16(_val23);
                __m256i _val32_16 = _mm256_permute4x64_epi64(_val23_16, 78);

#if __AVXVNNI__ || __AVX512VNNI__
                _sum04_15 = _mm256_dpwssd_epi32(_sum04_15, _val23_16, _w01_16);
                _sum14_05 = _mm256_dpwssd_epi32(_sum14_05, _val32_16, _w01_16);
                _sum06_17 = _mm256_dpwssd_epi32(_sum06_17, _val23_16, _w23_16);
                _sum16_07 = _mm256_dpwssd_epi32(_sum16_07, _val32_16, _w23_16);
#else
                __m256i _sl04_15 = _mm256_mullo_epi16(_val23_16, _w01_16);
                __m256i _sh04_15 = _mm256_mulhi_epi16(_val23_16, _w01_16);
                __m256i _sl14_05 = _mm256_mullo_epi16(_val32_16, _w01_16);
                __m256i _sh14_05 = _mm256_mulhi_epi16(_val32_16, _w01_16);
                __m256i _sl06_17 = _mm256_mullo_epi16(_val23_16, _w23_16);
                __m256i _sh06_17 = _mm256_mulhi_epi16(_val23_16, _w23_16);
                __m256i _sl16_07 = _mm256_mullo_epi16(_val32_16, _w23_16);
                __m256i _sh16_07 = _mm256_mulhi_epi16(_val32_16, _w23_16);

                _sum04_15 = _mm256_add_epi32(_sum04_15, _mm256_unpacklo_epi16(_sl04_15, _sh04_15));
                _sum14_05 = _mm256_add_epi32(_sum14_05, _mm256_unpacklo_epi16(_sl14_05, _sh14_05));
                _sum06_17 = _mm256_add_epi32(_sum06_17, _mm256_unpacklo_epi16(_sl06_17, _sh06_17));
                _sum16_07 = _mm256_add_epi32(_sum16_07, _mm256_unpacklo_epi16(_sl16_07, _sh16_07));
                _sum04_15 = _mm256_add_epi32(_sum04_15, _mm256_unpackhi_epi16(_sl04_15, _sh04_15));
                _sum14_05 = _mm256_add_epi32(_sum14_05, _mm256_unpackhi_epi16(_sl14_05, _sh14_05));
                _sum06_17 = _mm256_add_epi32(_sum06_17, _mm256_unpackhi_epi16(_sl06_17, _sh06_17));
                _sum16_07 = _mm256_add_epi32(_sum16_07, _mm256_unpackhi_epi16(_sl16_07, _sh16_07));
#endif

                tmpptr += 32;
                kptr0 += 32;
            }

            // transpose 4x8
            {
                __m256i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm256_unpacklo_epi32(_sum00_11, _sum10_01);
                _tmp1 = _mm256_unpacklo_epi32(_sum02_13, _sum12_03);
                _tmp2 = _mm256_unpackhi_epi32(_sum00_11, _sum10_01);
                _tmp3 = _mm256_unpackhi_epi32(_sum02_13, _sum12_03);
                _sum00_11 = _mm256_unpacklo_epi64(_tmp0, _tmp1);
                _sum10_01 = _mm256_unpackhi_epi64(_tmp0, _tmp1);
                _sum02_13 = _mm256_unpacklo_epi64(_tmp2, _tmp3);
                _sum12_03 = _mm256_unpackhi_epi64(_tmp2, _tmp3);
            }
            {
                __m256i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm256_unpacklo_epi32(_sum04_15, _sum14_05);
                _tmp1 = _mm256_unpacklo_epi32(_sum06_17, _sum16_07);
                _tmp2 = _mm256_unpackhi_epi32(_sum04_15, _sum14_05);
                _tmp3 = _mm256_unpackhi_epi32(_sum06_17, _sum16_07);
                _sum04_15 = _mm256_unpacklo_epi64(_tmp0, _tmp1);
                _sum14_05 = _mm256_unpackhi_epi64(_tmp0, _tmp1);
                _sum06_17 = _mm256_unpacklo_epi64(_tmp2, _tmp3);
                _sum16_07 = _mm256_unpackhi_epi64(_tmp2, _tmp3);
            }

            _sum00_11 = _mm256_add_epi32(_sum00_11, _sum10_01);
            _sum02_13 = _mm256_add_epi32(_sum02_13, _sum12_03);
            _sum00_11 = _mm256_add_epi32(_sum00_11, _sum02_13);

            _sum04_15 = _mm256_add_epi32(_sum04_15, _sum14_05);
            _sum06_17 = _mm256_add_epi32(_sum06_17, _sum16_07);
            _sum04_15 = _mm256_add_epi32(_sum04_15, _sum06_17);

            __m256i _perm_mask = _mm256_set_epi32(6, 3, 4, 1, 7, 2, 5, 0);
            _sum00_11 = _mm256_permutevar8x32_epi32(_sum00_11, _perm_mask);
            _sum04_15 = _mm256_permutevar8x32_epi32(_sum04_15, _perm_mask);

            _mm256_storeu_si256((__m256i*)outptr0, _sum00_11);
            _mm256_storeu_si256((__m256i*)(outptr0 + 8), _sum04_15);
            outptr0 += 16;
        }
#endif
        for (; i + 1 < size; i += 2)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2);
#endif
            const signed char* kptr0 = kernel.channel(p);

            int nn = inch * maxk; // inch always > 0

#if __AVX2__
            __m256i _sum00_11 = _mm256_setzero_si256();
            __m256i _sum10_01 = _mm256_setzero_si256();
            __m256i _sum02_13 = _mm256_setzero_si256();
            __m256i _sum12_03 = _mm256_setzero_si256();
#else
            __m128i _sum00 = _mm_setzero_si128();
            __m128i _sum01 = _mm_setzero_si128();
            __m128i _sum02 = _mm_setzero_si128();
            __m128i _sum03 = _mm_setzero_si128();
            __m128i _sum10 = _mm_setzero_si128();
            __m128i _sum11 = _mm_setzero_si128();
            __m128i _sum12 = _mm_setzero_si128();
            __m128i _sum13 = _mm_setzero_si128();
#endif

            int j = 0;
            for (; j < nn; j++)
            {
#if __AVX2__
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m256i _val01_16 = _mm256_cvtepi8_epi16(_val01);

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);
                __m256i _w23_16 = _mm256_cvtepi8_epi16(_w23);

                __m256i _val10_16 = _mm256_permute4x64_epi64(_val01_16, 78);

#if __AVXVNNI__ || __AVX512VNNI__
                _sum00_11 = _mm256_dpwssd_epi32(_sum00_11, _val01_16, _w01_16);
                _sum10_01 = _mm256_dpwssd_epi32(_sum10_01, _val10_16, _w01_16);
                _sum02_13 = _mm256_dpwssd_epi32(_sum02_13, _val01_16, _w23_16);
                _sum12_03 = _mm256_dpwssd_epi32(_sum12_03, _val10_16, _w23_16);
#else
                __m256i _sl00_11 = _mm256_mullo_epi16(_val01_16, _w01_16);
                __m256i _sh00_11 = _mm256_mulhi_epi16(_val01_16, _w01_16);
                __m256i _sl10_01 = _mm256_mullo_epi16(_val10_16, _w01_16);
                __m256i _sh10_01 = _mm256_mulhi_epi16(_val10_16, _w01_16);
                __m256i _sl02_13 = _mm256_mullo_epi16(_val01_16, _w23_16);
                __m256i _sh02_13 = _mm256_mulhi_epi16(_val01_16, _w23_16);
                __m256i _sl12_03 = _mm256_mullo_epi16(_val10_16, _w23_16);
                __m256i _sh12_03 = _mm256_mulhi_epi16(_val10_16, _w23_16);

                _sum00_11 = _mm256_add_epi32(_sum00_11, _mm256_unpacklo_epi16(_sl00_11, _sh00_11));
                _sum10_01 = _mm256_add_epi32(_sum10_01, _mm256_unpacklo_epi16(_sl10_01, _sh10_01));
                _sum02_13 = _mm256_add_epi32(_sum02_13, _mm256_unpacklo_epi16(_sl02_13, _sh02_13));
                _sum12_03 = _mm256_add_epi32(_sum12_03, _mm256_unpacklo_epi16(_sl12_03, _sh12_03));
                _sum00_11 = _mm256_add_epi32(_sum00_11, _mm256_unpackhi_epi16(_sl00_11, _sh00_11));
                _sum10_01 = _mm256_add_epi32(_sum10_01, _mm256_unpackhi_epi16(_sl10_01, _sh10_01));
                _sum02_13 = _mm256_add_epi32(_sum02_13, _mm256_unpackhi_epi16(_sl02_13, _sh02_13));
                _sum12_03 = _mm256_add_epi32(_sum12_03, _mm256_unpackhi_epi16(_sl12_03, _sh12_03));
#endif
#else
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m128i _extval01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _val01);
                __m128i _val0 = _mm_unpacklo_epi8(_val01, _extval01);
                __m128i _val1 = _mm_unpackhi_epi8(_val01, _extval01);

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                __m128i _extw23 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w23);
                __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
                __m128i _w1 = _mm_unpackhi_epi8(_w01, _extw01);
                __m128i _w2 = _mm_unpacklo_epi8(_w23, _extw23);
                __m128i _w3 = _mm_unpackhi_epi8(_w23, _extw23);

#if __XOP__
                _sum00 = _mm_maddd_epi16(_val0, _w0, _sum00);
                _sum01 = _mm_maddd_epi16(_val0, _w1, _sum01);
                _sum02 = _mm_maddd_epi16(_val0, _w2, _sum02);
                _sum03 = _mm_maddd_epi16(_val0, _w3, _sum03);
                _sum10 = _mm_maddd_epi16(_val1, _w0, _sum10);
                _sum11 = _mm_maddd_epi16(_val1, _w1, _sum11);
                _sum12 = _mm_maddd_epi16(_val1, _w2, _sum12);
                _sum13 = _mm_maddd_epi16(_val1, _w3, _sum13);
#else
                __m128i _sl00 = _mm_mullo_epi16(_val0, _w0);
                __m128i _sh00 = _mm_mulhi_epi16(_val0, _w0);
                __m128i _sl01 = _mm_mullo_epi16(_val0, _w1);
                __m128i _sh01 = _mm_mulhi_epi16(_val0, _w1);
                __m128i _sl02 = _mm_mullo_epi16(_val0, _w2);
                __m128i _sh02 = _mm_mulhi_epi16(_val0, _w2);
                __m128i _sl03 = _mm_mullo_epi16(_val0, _w3);
                __m128i _sh03 = _mm_mulhi_epi16(_val0, _w3);
                __m128i _sl10 = _mm_mullo_epi16(_val1, _w0);
                __m128i _sh10 = _mm_mulhi_epi16(_val1, _w0);
                __m128i _sl11 = _mm_mullo_epi16(_val1, _w1);
                __m128i _sh11 = _mm_mulhi_epi16(_val1, _w1);
                __m128i _sl12 = _mm_mullo_epi16(_val1, _w2);
                __m128i _sh12 = _mm_mulhi_epi16(_val1, _w2);
                __m128i _sl13 = _mm_mullo_epi16(_val1, _w3);
                __m128i _sh13 = _mm_mulhi_epi16(_val1, _w3);

                _sum00 = _mm_add_epi32(_sum00, _mm_unpacklo_epi16(_sl00, _sh00));
                _sum01 = _mm_add_epi32(_sum01, _mm_unpacklo_epi16(_sl01, _sh01));
                _sum02 = _mm_add_epi32(_sum02, _mm_unpacklo_epi16(_sl02, _sh02));
                _sum03 = _mm_add_epi32(_sum03, _mm_unpacklo_epi16(_sl03, _sh03));
                _sum00 = _mm_add_epi32(_sum00, _mm_unpackhi_epi16(_sl00, _sh00));
                _sum01 = _mm_add_epi32(_sum01, _mm_unpackhi_epi16(_sl01, _sh01));
                _sum02 = _mm_add_epi32(_sum02, _mm_unpackhi_epi16(_sl02, _sh02));
                _sum03 = _mm_add_epi32(_sum03, _mm_unpackhi_epi16(_sl03, _sh03));
                _sum10 = _mm_add_epi32(_sum10, _mm_unpacklo_epi16(_sl10, _sh10));
                _sum11 = _mm_add_epi32(_sum11, _mm_unpacklo_epi16(_sl11, _sh11));
                _sum12 = _mm_add_epi32(_sum12, _mm_unpacklo_epi16(_sl12, _sh12));
                _sum13 = _mm_add_epi32(_sum13, _mm_unpacklo_epi16(_sl13, _sh13));
                _sum10 = _mm_add_epi32(_sum10, _mm_unpackhi_epi16(_sl10, _sh10));
                _sum11 = _mm_add_epi32(_sum11, _mm_unpackhi_epi16(_sl11, _sh11));
                _sum12 = _mm_add_epi32(_sum12, _mm_unpackhi_epi16(_sl12, _sh12));
                _sum13 = _mm_add_epi32(_sum13, _mm_unpackhi_epi16(_sl13, _sh13));
#endif
#endif

                tmpptr += 16;
                kptr0 += 32;
            }

#if __AVX2__
            // transpose 4x8
            {
                __m256i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm256_unpacklo_epi32(_sum00_11, _sum10_01);
                _tmp1 = _mm256_unpacklo_epi32(_sum02_13, _sum12_03);
                _tmp2 = _mm256_unpackhi_epi32(_sum00_11, _sum10_01);
                _tmp3 = _mm256_unpackhi_epi32(_sum02_13, _sum12_03);
                _sum00_11 = _mm256_unpacklo_epi64(_tmp0, _tmp1);
                _sum10_01 = _mm256_unpackhi_epi64(_tmp0, _tmp1);
                _sum02_13 = _mm256_unpacklo_epi64(_tmp2, _tmp3);
                _sum12_03 = _mm256_unpackhi_epi64(_tmp2, _tmp3);
            }

            _sum00_11 = _mm256_add_epi32(_sum00_11, _sum10_01);
            _sum02_13 = _mm256_add_epi32(_sum02_13, _sum12_03);
            _sum00_11 = _mm256_add_epi32(_sum00_11, _sum02_13);

            __m256i _perm_mask = _mm256_set_epi32(6, 3, 4, 1, 7, 2, 5, 0);
            _sum00_11 = _mm256_permutevar8x32_epi32(_sum00_11, _perm_mask);

            _mm256_storeu_si256((__m256i*)outptr0, _sum00_11);
#else
            // transpose 4x4
            {
                __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm_unpacklo_epi32(_sum00, _sum01);
                _tmp1 = _mm_unpacklo_epi32(_sum02, _sum03);
                _tmp2 = _mm_unpackhi_epi32(_sum00, _sum01);
                _tmp3 = _mm_unpackhi_epi32(_sum02, _sum03);
                _sum00 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                _sum01 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                _sum02 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                _sum03 = _mm_unpackhi_epi64(_tmp2, _tmp3);
            }
            {
                __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm_unpacklo_epi32(_sum10, _sum11);
                _tmp1 = _mm_unpacklo_epi32(_sum12, _sum13);
                _tmp2 = _mm_unpackhi_epi32(_sum10, _sum11);
                _tmp3 = _mm_unpackhi_epi32(_sum12, _sum13);
                _sum10 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                _sum11 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                _sum12 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                _sum13 = _mm_unpackhi_epi64(_tmp2, _tmp3);
            }

            _sum00 = _mm_add_epi32(_sum00, _sum01);
            _sum02 = _mm_add_epi32(_sum02, _sum03);
            _sum10 = _mm_add_epi32(_sum10, _sum11);
            _sum12 = _mm_add_epi32(_sum12, _sum13);

            _sum00 = _mm_add_epi32(_sum00, _sum02);
            _sum10 = _mm_add_epi32(_sum10, _sum12);

            _mm_storeu_si128((__m128i*)outptr0, _sum00);
            _mm_storeu_si128((__m128i*)(outptr0 + 4), _sum10);
#endif
            outptr0 += 8;
        }
        for (; i < size; i++)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2 + i % 2);
#endif
            const signed char* kptr0 = kernel.channel(p);

            int nn = inch * maxk; // inch always > 0

#if __AVX2__
            __m256i _sum0_1 = _mm256_setzero_si256();
            __m256i _sum2_3 = _mm256_setzero_si256();
#else
            __m128i _sum0 = _mm_setzero_si128();
            __m128i _sum1 = _mm_setzero_si128();
            __m128i _sum2 = _mm_setzero_si128();
            __m128i _sum3 = _mm_setzero_si128();
#endif

            int j = 0;
            for (; j < nn; j++)
            {
#if __AVX2__
                __m128i _val = _mm_loadl_epi64((const __m128i*)tmpptr);
                _val = _mm_cvtepi8_epi16(_val);

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);
                __m256i _w23_16 = _mm256_cvtepi8_epi16(_w23);

                __m256i _valval = _mm256_inserti128_si256(_mm256_castsi128_si256(_val), _val, 1);

#if __AVXVNNI__ || __AVX512VNNI__
                _sum0_1 = _mm256_dpwssd_epi32(_sum0_1, _valval, _w01_16);
                _sum2_3 = _mm256_dpwssd_epi32(_sum2_3, _valval, _w23_16);
#else
                __m256i _sl0_1 = _mm256_mullo_epi16(_valval, _w01_16);
                __m256i _sh0_1 = _mm256_mulhi_epi16(_valval, _w01_16);
                __m256i _sl2_3 = _mm256_mullo_epi16(_valval, _w23_16);
                __m256i _sh2_3 = _mm256_mulhi_epi16(_valval, _w23_16);

                _sum0_1 = _mm256_add_epi32(_sum0_1, _mm256_unpacklo_epi16(_sl0_1, _sh0_1));
                _sum2_3 = _mm256_add_epi32(_sum2_3, _mm256_unpacklo_epi16(_sl2_3, _sh2_3));
                _sum0_1 = _mm256_add_epi32(_sum0_1, _mm256_unpackhi_epi16(_sl0_1, _sh0_1));
                _sum2_3 = _mm256_add_epi32(_sum2_3, _mm256_unpackhi_epi16(_sl2_3, _sh2_3));
#endif
#else
                __m128i _val = _mm_loadl_epi64((const __m128i*)tmpptr);
#if __SSE4_1__
                _val = _mm_cvtepi8_epi16(_val);
#else
                _val = _mm_unpacklo_epi8(_val, _mm_cmpgt_epi8(_mm_setzero_si128(), _val));
#endif

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                __m128i _extw23 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w23);
                __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
                __m128i _w1 = _mm_unpackhi_epi8(_w01, _extw01);
                __m128i _w2 = _mm_unpacklo_epi8(_w23, _extw23);
                __m128i _w3 = _mm_unpackhi_epi8(_w23, _extw23);

#if __XOP__
                _sum0 = _mm_maddd_epi16(_val, _w0, _sum0);
                _sum1 = _mm_maddd_epi16(_val, _w1, _sum1);
                _sum2 = _mm_maddd_epi16(_val, _w2, _sum2);
                _sum3 = _mm_maddd_epi16(_val, _w3, _sum3);
#else
                __m128i _sl0 = _mm_mullo_epi16(_val, _w0);
                __m128i _sh0 = _mm_mulhi_epi16(_val, _w0);
                __m128i _sl1 = _mm_mullo_epi16(_val, _w1);
                __m128i _sh1 = _mm_mulhi_epi16(_val, _w1);
                __m128i _sl2 = _mm_mullo_epi16(_val, _w2);
                __m128i _sh2 = _mm_mulhi_epi16(_val, _w2);
                __m128i _sl3 = _mm_mullo_epi16(_val, _w3);
                __m128i _sh3 = _mm_mulhi_epi16(_val, _w3);

                _sum0 = _mm_add_epi32(_sum0, _mm_unpacklo_epi16(_sl0, _sh0));
                _sum1 = _mm_add_epi32(_sum1, _mm_unpacklo_epi16(_sl1, _sh1));
                _sum2 = _mm_add_epi32(_sum2, _mm_unpacklo_epi16(_sl2, _sh2));
                _sum3 = _mm_add_epi32(_sum3, _mm_unpacklo_epi16(_sl3, _sh3));
                _sum0 = _mm_add_epi32(_sum0, _mm_unpackhi_epi16(_sl0, _sh0));
                _sum1 = _mm_add_epi32(_sum1, _mm_unpackhi_epi16(_sl1, _sh1));
                _sum2 = _mm_add_epi32(_sum2, _mm_unpackhi_epi16(_sl2, _sh2));
                _sum3 = _mm_add_epi32(_sum3, _mm_unpackhi_epi16(_sl3, _sh3));
#endif
#endif

                tmpptr += 8;
                kptr0 += 32;
            }

#if __AVX2__
            __m128i _sum0 = _mm256_extracti128_si256(_sum0_1, 0);
            __m128i _sum1 = _mm256_extracti128_si256(_sum0_1, 1);
            __m128i _sum2 = _mm256_extracti128_si256(_sum2_3, 0);
            __m128i _sum3 = _mm256_extracti128_si256(_sum2_3, 1);
#endif

            // transpose 4x4
            {
                __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm_unpacklo_epi32(_sum0, _sum1);
                _tmp1 = _mm_unpacklo_epi32(_sum2, _sum3);
                _tmp2 = _mm_unpackhi_epi32(_sum0, _sum1);
                _tmp3 = _mm_unpackhi_epi32(_sum2, _sum3);
                _sum0 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                _sum1 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                _sum2 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                _sum3 = _mm_unpackhi_epi64(_tmp2, _tmp3);
            }

            _sum0 = _mm_add_epi32(_sum0, _sum1);
            _sum2 = _mm_add_epi32(_sum2, _sum3);

            _sum0 = _mm_add_epi32(_sum0, _sum2);

            _mm_storeu_si128((__m128i*)outptr0, _sum0);
            outptr0 += 4;
        }
    }
}